

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O1

bool embree::avx512::CurveNiIntersectorK<8,8>::
     occluded_hn<embree::avx512::OrientedCurve1IntersectorK<embree::HermiteCurveT,8>,embree::avx512::Occluded1KEpilog1<8,true>>
               (Precalculations *pre,RayK<8> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  float fVar1;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar2;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  Primitive PVar6;
  uint uVar7;
  Geometry *pGVar8;
  long lVar9;
  __int_type_conflict _Var10;
  RTCFilterFunctionN p_Var11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  undefined8 uVar19;
  bool bVar20;
  undefined8 uVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  byte bVar33;
  uint uVar34;
  ulong uVar35;
  uint uVar37;
  uint uVar38;
  ulong uVar39;
  long lVar40;
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  ulong uVar41;
  uint uVar42;
  bool bVar43;
  bool bVar44;
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar99 [32];
  undefined1 auVar101 [32];
  undefined1 auVar103 [32];
  undefined1 auVar105 [32];
  undefined1 auVar107 [32];
  int iVar109;
  float fVar110;
  undefined4 uVar111;
  vfloat4 a0_2;
  undefined1 auVar112 [16];
  float fVar113;
  float fVar114;
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  vfloat4 b0;
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  float fVar131;
  vfloat4 a0_3;
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  __m128 a_1;
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  float fVar172;
  float fVar173;
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  float fVar174;
  undefined1 auVar171 [32];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [32];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [32];
  undefined1 auVar189 [32];
  undefined1 auVar190 [32];
  float fVar191;
  float fVar204;
  float fVar205;
  __m128 a;
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  float fVar206;
  float fVar207;
  float fVar215;
  float fVar216;
  float fVar217;
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  float fVar218;
  float fVar226;
  float fVar227;
  vfloat4 a0_1;
  undefined1 auVar219 [16];
  float fVar228;
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  vfloat4 a0;
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [32];
  undefined1 auVar239 [64];
  undefined1 auVar240 [64];
  undefined1 auVar241 [64];
  undefined1 auVar242 [64];
  undefined1 auVar243 [64];
  undefined1 auVar244 [64];
  undefined1 auVar245 [64];
  undefined1 auVar246 [64];
  int iVar247;
  undefined1 in_ZMM31 [64];
  undefined1 auVar248 [64];
  uint mask_stack [4];
  RTCFilterFunctionNArguments args;
  BBox1f cu_stack [4];
  BBox1f cv_stack [4];
  bool local_5a1;
  float local_450;
  float fStack_44c;
  float fStack_448;
  float fStack_444;
  uint auStack_420 [4];
  RTCFilterFunctionNArguments local_410;
  undefined8 local_3e0;
  undefined8 uStack_3d8;
  undefined8 uStack_3d0;
  undefined8 uStack_3c8;
  undefined1 local_3c0 [8];
  float fStack_3b8;
  float fStack_3b4;
  undefined1 local_3b0 [16];
  undefined1 local_3a0 [16];
  undefined1 local_390 [16];
  undefined1 local_380 [8];
  float fStack_378;
  float fStack_374;
  undefined1 local_370 [8];
  float fStack_368;
  float fStack_364;
  undefined1 local_360 [16];
  undefined1 local_350 [16];
  undefined1 local_340 [8];
  float fStack_338;
  float fStack_334;
  undefined1 local_330 [16];
  undefined1 local_320 [8];
  float fStack_318;
  float fStack_314;
  undefined1 local_310 [16];
  undefined1 local_300 [16];
  undefined1 local_2f0 [16];
  undefined1 local_2e0 [16];
  undefined1 local_2d0 [16];
  undefined1 local_2c0 [16];
  undefined1 local_2b0 [16];
  undefined1 local_2a0 [16];
  undefined1 local_290 [16];
  uint uStack_280;
  float afStack_27c [7];
  undefined1 local_260 [32];
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  undefined1 local_200 [32];
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [32];
  ulong auStack_1a0 [4];
  RTCHitN local_180 [32];
  undefined1 local_160 [32];
  undefined4 local_140;
  undefined4 uStack_13c;
  undefined4 uStack_138;
  undefined4 uStack_134;
  undefined4 uStack_130;
  undefined4 uStack_12c;
  undefined4 uStack_128;
  undefined4 uStack_124;
  float local_120;
  float fStack_11c;
  float fStack_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float fStack_108;
  float fStack_104;
  undefined1 local_100 [32];
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  undefined1 local_c0 [32];
  uint local_a0;
  uint uStack_9c;
  uint uStack_98;
  uint uStack_94;
  uint uStack_90;
  uint uStack_8c;
  uint uStack_88;
  uint uStack_84;
  uint local_80;
  uint uStack_7c;
  uint uStack_78;
  uint uStack_74;
  uint uStack_70;
  uint uStack_6c;
  uint uStack_68;
  uint uStack_64;
  ulong uVar36;
  undefined1 auVar98 [32];
  undefined1 auVar100 [32];
  undefined1 auVar102 [32];
  undefined1 auVar104 [32];
  undefined1 auVar106 [32];
  undefined1 auVar108 [32];
  
  PVar6 = prim[1];
  uVar35 = (ulong)(byte)PVar6;
  fVar1 = *(float *)(prim + uVar35 * 0x19 + 0x12);
  auVar45 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                          0x10);
  auVar45 = vinsertps_avx(auVar45,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar54 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar46 = vinsertps_avx(auVar54,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  auVar48 = vsubps_avx(auVar45,*(undefined1 (*) [16])(prim + uVar35 * 0x19 + 6));
  fVar131 = fVar1 * auVar48._0_4_;
  fVar110 = fVar1 * auVar46._0_4_;
  auVar45._8_8_ = 0;
  auVar45._0_8_ = *(ulong *)(prim + uVar35 * 4 + 6);
  auVar82 = vpmovsxbd_avx2(auVar45);
  auVar82 = vcvtdq2ps_avx(auVar82);
  auVar54._8_8_ = 0;
  auVar54._0_8_ = *(ulong *)(prim + uVar35 * 5 + 6);
  auVar80 = vpmovsxbd_avx2(auVar54);
  auVar80 = vcvtdq2ps_avx(auVar80);
  auVar4._8_8_ = 0;
  auVar4._0_8_ = *(ulong *)(prim + uVar35 * 6 + 6);
  auVar81 = vpmovsxbd_avx2(auVar4);
  auVar81 = vcvtdq2ps_avx(auVar81);
  auVar55._8_8_ = 0;
  auVar55._0_8_ = *(ulong *)(prim + uVar35 * 0xb + 6);
  auVar93 = vpmovsxbd_avx2(auVar55);
  auVar93 = vcvtdq2ps_avx(auVar93);
  auVar56._8_8_ = 0;
  auVar56._0_8_ = *(ulong *)(prim + (ulong)((uint)(byte)PVar6 * 0xc) + 6);
  auVar83 = vpmovsxbd_avx2(auVar56);
  auVar83 = vcvtdq2ps_avx(auVar83);
  auVar51._8_8_ = 0;
  auVar51._0_8_ = *(ulong *)(prim + (uint)(byte)PVar6 * 0xc + uVar35 + 6);
  auVar84 = vpmovsxbd_avx2(auVar51);
  auVar84 = vcvtdq2ps_avx(auVar84);
  uVar41 = (ulong)(uint)((int)(uVar35 * 9) * 2);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = *(ulong *)(prim + uVar41 + 6);
  auVar85 = vpmovsxbd_avx2(auVar5);
  auVar57._8_8_ = 0;
  auVar57._0_8_ = *(ulong *)(prim + uVar41 + uVar35 + 6);
  auVar88 = vpmovsxbd_avx2(auVar57);
  auVar85 = vcvtdq2ps_avx(auVar85);
  auVar86 = vcvtdq2ps_avx(auVar88);
  uVar39 = (ulong)(uint)((int)(uVar35 * 5) << 2);
  auVar47._8_8_ = 0;
  auVar47._0_8_ = *(ulong *)(prim + uVar39 + 6);
  auVar78 = vpmovsxbd_avx2(auVar47);
  auVar87 = vcvtdq2ps_avx(auVar78);
  auVar139._4_4_ = fVar110;
  auVar139._0_4_ = fVar110;
  auVar139._8_4_ = fVar110;
  auVar139._12_4_ = fVar110;
  auVar139._16_4_ = fVar110;
  auVar139._20_4_ = fVar110;
  auVar139._24_4_ = fVar110;
  auVar139._28_4_ = fVar110;
  auVar238._8_4_ = 1;
  auVar238._0_8_ = 0x100000001;
  auVar238._12_4_ = 1;
  auVar238._16_4_ = 1;
  auVar238._20_4_ = 1;
  auVar238._24_4_ = 1;
  auVar238._28_4_ = 1;
  auVar89 = ZEXT1632(CONCAT412(fVar1 * auVar46._12_4_,
                               CONCAT48(fVar1 * auVar46._8_4_,
                                        CONCAT44(fVar1 * auVar46._4_4_,fVar110))));
  auVar79 = vpermps_avx2(auVar238,auVar89);
  auVar76 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar246 = ZEXT3264(auVar76);
  auVar77 = vpermps_avx512vl(auVar76,auVar89);
  fVar110 = auVar77._0_4_;
  fVar206 = auVar77._4_4_;
  auVar89._4_4_ = fVar206 * auVar81._4_4_;
  auVar89._0_4_ = fVar110 * auVar81._0_4_;
  fVar191 = auVar77._8_4_;
  auVar89._8_4_ = fVar191 * auVar81._8_4_;
  fVar204 = auVar77._12_4_;
  auVar89._12_4_ = fVar204 * auVar81._12_4_;
  fVar205 = auVar77._16_4_;
  auVar89._16_4_ = fVar205 * auVar81._16_4_;
  fVar113 = auVar77._20_4_;
  auVar89._20_4_ = fVar113 * auVar81._20_4_;
  fVar114 = auVar77._24_4_;
  auVar89._24_4_ = fVar114 * auVar81._24_4_;
  auVar89._28_4_ = auVar88._28_4_;
  auVar88._4_4_ = auVar84._4_4_ * fVar206;
  auVar88._0_4_ = auVar84._0_4_ * fVar110;
  auVar88._8_4_ = auVar84._8_4_ * fVar191;
  auVar88._12_4_ = auVar84._12_4_ * fVar204;
  auVar88._16_4_ = auVar84._16_4_ * fVar205;
  auVar88._20_4_ = auVar84._20_4_ * fVar113;
  auVar88._24_4_ = auVar84._24_4_ * fVar114;
  auVar88._28_4_ = auVar78._28_4_;
  auVar78._4_4_ = auVar87._4_4_ * fVar206;
  auVar78._0_4_ = auVar87._0_4_ * fVar110;
  auVar78._8_4_ = auVar87._8_4_ * fVar191;
  auVar78._12_4_ = auVar87._12_4_ * fVar204;
  auVar78._16_4_ = auVar87._16_4_ * fVar205;
  auVar78._20_4_ = auVar87._20_4_ * fVar113;
  auVar78._24_4_ = auVar87._24_4_ * fVar114;
  auVar78._28_4_ = auVar77._28_4_;
  auVar45 = vfmadd231ps_fma(auVar89,auVar79,auVar80);
  auVar54 = vfmadd231ps_fma(auVar88,auVar79,auVar83);
  auVar4 = vfmadd231ps_fma(auVar78,auVar86,auVar79);
  auVar45 = vfmadd231ps_fma(ZEXT1632(auVar45),auVar139,auVar82);
  auVar54 = vfmadd231ps_fma(ZEXT1632(auVar54),auVar139,auVar93);
  auVar4 = vfmadd231ps_fma(ZEXT1632(auVar4),auVar85,auVar139);
  auVar146._4_4_ = fVar131;
  auVar146._0_4_ = fVar131;
  auVar146._8_4_ = fVar131;
  auVar146._12_4_ = fVar131;
  auVar146._16_4_ = fVar131;
  auVar146._20_4_ = fVar131;
  auVar146._24_4_ = fVar131;
  auVar146._28_4_ = fVar131;
  auVar78 = ZEXT1632(CONCAT412(fVar1 * auVar48._12_4_,
                               CONCAT48(fVar1 * auVar48._8_4_,
                                        CONCAT44(fVar1 * auVar48._4_4_,fVar131))));
  auVar88 = vpermps_avx2(auVar238,auVar78);
  auVar78 = vpermps_avx512vl(auVar76,auVar78);
  auVar79 = vmulps_avx512vl(auVar78,auVar81);
  auVar91._0_4_ = auVar78._0_4_ * auVar84._0_4_;
  auVar91._4_4_ = auVar78._4_4_ * auVar84._4_4_;
  auVar91._8_4_ = auVar78._8_4_ * auVar84._8_4_;
  auVar91._12_4_ = auVar78._12_4_ * auVar84._12_4_;
  auVar91._16_4_ = auVar78._16_4_ * auVar84._16_4_;
  auVar91._20_4_ = auVar78._20_4_ * auVar84._20_4_;
  auVar91._24_4_ = auVar78._24_4_ * auVar84._24_4_;
  auVar91._28_4_ = 0;
  auVar84._4_4_ = auVar78._4_4_ * auVar87._4_4_;
  auVar84._0_4_ = auVar78._0_4_ * auVar87._0_4_;
  auVar84._8_4_ = auVar78._8_4_ * auVar87._8_4_;
  auVar84._12_4_ = auVar78._12_4_ * auVar87._12_4_;
  auVar84._16_4_ = auVar78._16_4_ * auVar87._16_4_;
  auVar84._20_4_ = auVar78._20_4_ * auVar87._20_4_;
  auVar84._24_4_ = auVar78._24_4_ * auVar87._24_4_;
  auVar84._28_4_ = auVar81._28_4_;
  auVar80 = vfmadd231ps_avx512vl(auVar79,auVar88,auVar80);
  auVar55 = vfmadd231ps_fma(auVar91,auVar88,auVar83);
  auVar56 = vfmadd231ps_fma(auVar84,auVar88,auVar86);
  auVar80 = vfmadd231ps_avx512vl(auVar80,auVar146,auVar82);
  auVar55 = vfmadd231ps_fma(ZEXT1632(auVar55),auVar146,auVar93);
  auVar56 = vfmadd231ps_fma(ZEXT1632(auVar56),auVar146,auVar85);
  auVar94._8_4_ = 0x7fffffff;
  auVar94._0_8_ = 0x7fffffff7fffffff;
  auVar94._12_4_ = 0x7fffffff;
  auVar94._16_4_ = 0x7fffffff;
  auVar94._20_4_ = 0x7fffffff;
  auVar94._24_4_ = 0x7fffffff;
  auVar94._28_4_ = 0x7fffffff;
  auVar82 = vandps_avx(ZEXT1632(auVar45),auVar94);
  auVar96._8_4_ = 0x219392ef;
  auVar96._0_8_ = 0x219392ef219392ef;
  auVar96._12_4_ = 0x219392ef;
  auVar96._16_4_ = 0x219392ef;
  auVar96._20_4_ = 0x219392ef;
  auVar96._24_4_ = 0x219392ef;
  auVar96._28_4_ = 0x219392ef;
  uVar41 = vcmpps_avx512vl(auVar82,auVar96,1);
  bVar43 = (bool)((byte)uVar41 & 1);
  auVar79._0_4_ = (uint)bVar43 * 0x219392ef | (uint)!bVar43 * auVar45._0_4_;
  bVar43 = (bool)((byte)(uVar41 >> 1) & 1);
  auVar79._4_4_ = (uint)bVar43 * 0x219392ef | (uint)!bVar43 * auVar45._4_4_;
  bVar43 = (bool)((byte)(uVar41 >> 2) & 1);
  auVar79._8_4_ = (uint)bVar43 * 0x219392ef | (uint)!bVar43 * auVar45._8_4_;
  bVar43 = (bool)((byte)(uVar41 >> 3) & 1);
  auVar79._12_4_ = (uint)bVar43 * 0x219392ef | (uint)!bVar43 * auVar45._12_4_;
  auVar79._16_4_ = (uint)((byte)(uVar41 >> 4) & 1) * 0x219392ef;
  auVar79._20_4_ = (uint)((byte)(uVar41 >> 5) & 1) * 0x219392ef;
  auVar79._24_4_ = (uint)((byte)(uVar41 >> 6) & 1) * 0x219392ef;
  auVar79._28_4_ = (uint)(byte)(uVar41 >> 7) * 0x219392ef;
  auVar82 = vandps_avx(ZEXT1632(auVar54),auVar94);
  uVar41 = vcmpps_avx512vl(auVar82,auVar96,1);
  bVar43 = (bool)((byte)uVar41 & 1);
  auVar76._0_4_ = (uint)bVar43 * 0x219392ef | (uint)!bVar43 * auVar54._0_4_;
  bVar43 = (bool)((byte)(uVar41 >> 1) & 1);
  auVar76._4_4_ = (uint)bVar43 * 0x219392ef | (uint)!bVar43 * auVar54._4_4_;
  bVar43 = (bool)((byte)(uVar41 >> 2) & 1);
  auVar76._8_4_ = (uint)bVar43 * 0x219392ef | (uint)!bVar43 * auVar54._8_4_;
  bVar43 = (bool)((byte)(uVar41 >> 3) & 1);
  auVar76._12_4_ = (uint)bVar43 * 0x219392ef | (uint)!bVar43 * auVar54._12_4_;
  auVar76._16_4_ = (uint)((byte)(uVar41 >> 4) & 1) * 0x219392ef;
  auVar76._20_4_ = (uint)((byte)(uVar41 >> 5) & 1) * 0x219392ef;
  auVar76._24_4_ = (uint)((byte)(uVar41 >> 6) & 1) * 0x219392ef;
  auVar76._28_4_ = (uint)(byte)(uVar41 >> 7) * 0x219392ef;
  auVar82 = vandps_avx(ZEXT1632(auVar4),auVar94);
  uVar41 = vcmpps_avx512vl(auVar82,auVar96,1);
  bVar43 = (bool)((byte)uVar41 & 1);
  auVar82._0_4_ = (uint)bVar43 * 0x219392ef | (uint)!bVar43 * auVar4._0_4_;
  bVar43 = (bool)((byte)(uVar41 >> 1) & 1);
  auVar82._4_4_ = (uint)bVar43 * 0x219392ef | (uint)!bVar43 * auVar4._4_4_;
  bVar43 = (bool)((byte)(uVar41 >> 2) & 1);
  auVar82._8_4_ = (uint)bVar43 * 0x219392ef | (uint)!bVar43 * auVar4._8_4_;
  bVar43 = (bool)((byte)(uVar41 >> 3) & 1);
  auVar82._12_4_ = (uint)bVar43 * 0x219392ef | (uint)!bVar43 * auVar4._12_4_;
  auVar82._16_4_ = (uint)((byte)(uVar41 >> 4) & 1) * 0x219392ef;
  auVar82._20_4_ = (uint)((byte)(uVar41 >> 5) & 1) * 0x219392ef;
  auVar82._24_4_ = (uint)((byte)(uVar41 >> 6) & 1) * 0x219392ef;
  auVar82._28_4_ = (uint)(byte)(uVar41 >> 7) * 0x219392ef;
  auVar81 = vrcp14ps_avx512vl(auVar79);
  auVar95._8_4_ = 0x3f800000;
  auVar95._0_8_ = &DAT_3f8000003f800000;
  auVar95._12_4_ = 0x3f800000;
  auVar95._16_4_ = 0x3f800000;
  auVar95._20_4_ = 0x3f800000;
  auVar95._24_4_ = 0x3f800000;
  auVar95._28_4_ = 0x3f800000;
  auVar45 = vfnmadd213ps_fma(auVar79,auVar81,auVar95);
  auVar45 = vfmadd132ps_fma(ZEXT1632(auVar45),auVar81,auVar81);
  auVar81 = vrcp14ps_avx512vl(auVar76);
  auVar54 = vfnmadd213ps_fma(auVar76,auVar81,auVar95);
  auVar54 = vfmadd132ps_fma(ZEXT1632(auVar54),auVar81,auVar81);
  auVar81 = vrcp14ps_avx512vl(auVar82);
  auVar4 = vfnmadd213ps_fma(auVar82,auVar81,auVar95);
  auVar4 = vfmadd132ps_fma(ZEXT1632(auVar4),auVar81,auVar81);
  auVar82 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar35 * 7 + 6));
  auVar82 = vcvtdq2ps_avx(auVar82);
  auVar81 = vsubps_avx512vl(auVar82,auVar80);
  auVar82 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar35 * 9 + 6));
  auVar85._4_4_ = auVar45._4_4_ * auVar81._4_4_;
  auVar85._0_4_ = auVar45._0_4_ * auVar81._0_4_;
  auVar85._8_4_ = auVar45._8_4_ * auVar81._8_4_;
  auVar85._12_4_ = auVar45._12_4_ * auVar81._12_4_;
  auVar85._16_4_ = auVar81._16_4_ * 0.0;
  auVar85._20_4_ = auVar81._20_4_ * 0.0;
  auVar85._24_4_ = auVar81._24_4_ * 0.0;
  auVar85._28_4_ = auVar81._28_4_;
  auVar82 = vcvtdq2ps_avx(auVar82);
  auVar82 = vsubps_avx512vl(auVar82,auVar80);
  auVar92._0_4_ = auVar45._0_4_ * auVar82._0_4_;
  auVar92._4_4_ = auVar45._4_4_ * auVar82._4_4_;
  auVar92._8_4_ = auVar45._8_4_ * auVar82._8_4_;
  auVar92._12_4_ = auVar45._12_4_ * auVar82._12_4_;
  auVar92._16_4_ = auVar82._16_4_ * 0.0;
  auVar92._20_4_ = auVar82._20_4_ * 0.0;
  auVar92._24_4_ = auVar82._24_4_ * 0.0;
  auVar92._28_4_ = 0;
  auVar80 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + (ulong)(byte)PVar6 * 0x10 + 6));
  auVar82 = vpmovsxwd_avx2(*(undefined1 (*) [16])
                            (prim + (ulong)(byte)PVar6 * 0x10 + uVar35 * -2 + 6));
  auVar82 = vcvtdq2ps_avx(auVar82);
  auVar82 = vsubps_avx(auVar82,ZEXT1632(auVar55));
  auVar86._4_4_ = auVar54._4_4_ * auVar82._4_4_;
  auVar86._0_4_ = auVar54._0_4_ * auVar82._0_4_;
  auVar86._8_4_ = auVar54._8_4_ * auVar82._8_4_;
  auVar86._12_4_ = auVar54._12_4_ * auVar82._12_4_;
  auVar86._16_4_ = auVar82._16_4_ * 0.0;
  auVar86._20_4_ = auVar82._20_4_ * 0.0;
  auVar86._24_4_ = auVar82._24_4_ * 0.0;
  auVar86._28_4_ = auVar82._28_4_;
  auVar82 = vcvtdq2ps_avx(auVar80);
  auVar82 = vsubps_avx(auVar82,ZEXT1632(auVar55));
  auVar90._0_4_ = auVar54._0_4_ * auVar82._0_4_;
  auVar90._4_4_ = auVar54._4_4_ * auVar82._4_4_;
  auVar90._8_4_ = auVar54._8_4_ * auVar82._8_4_;
  auVar90._12_4_ = auVar54._12_4_ * auVar82._12_4_;
  auVar90._16_4_ = auVar82._16_4_ * 0.0;
  auVar90._20_4_ = auVar82._20_4_ * 0.0;
  auVar90._24_4_ = auVar82._24_4_ * 0.0;
  auVar90._28_4_ = 0;
  auVar82 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar39 + uVar35 + 6));
  auVar82 = vcvtdq2ps_avx(auVar82);
  auVar82 = vsubps_avx(auVar82,ZEXT1632(auVar56));
  auVar87._4_4_ = auVar82._4_4_ * auVar4._4_4_;
  auVar87._0_4_ = auVar82._0_4_ * auVar4._0_4_;
  auVar87._8_4_ = auVar82._8_4_ * auVar4._8_4_;
  auVar87._12_4_ = auVar82._12_4_ * auVar4._12_4_;
  auVar87._16_4_ = auVar82._16_4_ * 0.0;
  auVar87._20_4_ = auVar82._20_4_ * 0.0;
  auVar87._24_4_ = auVar82._24_4_ * 0.0;
  auVar87._28_4_ = auVar82._28_4_;
  auVar82 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar35 * 0x17 + 6));
  auVar82 = vcvtdq2ps_avx(auVar82);
  auVar82 = vsubps_avx(auVar82,ZEXT1632(auVar56));
  auVar77._0_4_ = auVar4._0_4_ * auVar82._0_4_;
  auVar77._4_4_ = auVar4._4_4_ * auVar82._4_4_;
  auVar77._8_4_ = auVar4._8_4_ * auVar82._8_4_;
  auVar77._12_4_ = auVar4._12_4_ * auVar82._12_4_;
  auVar77._16_4_ = auVar82._16_4_ * 0.0;
  auVar77._20_4_ = auVar82._20_4_ * 0.0;
  auVar77._24_4_ = auVar82._24_4_ * 0.0;
  auVar77._28_4_ = 0;
  auVar82 = vpminsd_avx2(auVar85,auVar92);
  auVar80 = vpminsd_avx2(auVar86,auVar90);
  auVar82 = vmaxps_avx(auVar82,auVar80);
  auVar80 = vpminsd_avx2(auVar87,auVar77);
  uVar111 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar81._4_4_ = uVar111;
  auVar81._0_4_ = uVar111;
  auVar81._8_4_ = uVar111;
  auVar81._12_4_ = uVar111;
  auVar81._16_4_ = uVar111;
  auVar81._20_4_ = uVar111;
  auVar81._24_4_ = uVar111;
  auVar81._28_4_ = uVar111;
  auVar80 = vmaxps_avx512vl(auVar80,auVar81);
  auVar82 = vmaxps_avx(auVar82,auVar80);
  auVar80._8_4_ = 0x3f7ffffa;
  auVar80._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar80._12_4_ = 0x3f7ffffa;
  auVar80._16_4_ = 0x3f7ffffa;
  auVar80._20_4_ = 0x3f7ffffa;
  auVar80._24_4_ = 0x3f7ffffa;
  auVar80._28_4_ = 0x3f7ffffa;
  local_200 = vmulps_avx512vl(auVar82,auVar80);
  auVar82 = vpmaxsd_avx2(auVar85,auVar92);
  auVar80 = vpmaxsd_avx2(auVar86,auVar90);
  auVar82 = vminps_avx(auVar82,auVar80);
  auVar80 = vpmaxsd_avx2(auVar87,auVar77);
  uVar111 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar93._4_4_ = uVar111;
  auVar93._0_4_ = uVar111;
  auVar93._8_4_ = uVar111;
  auVar93._12_4_ = uVar111;
  auVar93._16_4_ = uVar111;
  auVar93._20_4_ = uVar111;
  auVar93._24_4_ = uVar111;
  auVar93._28_4_ = uVar111;
  auVar80 = vminps_avx512vl(auVar80,auVar93);
  auVar82 = vminps_avx(auVar82,auVar80);
  auVar83._8_4_ = 0x3f800003;
  auVar83._0_8_ = 0x3f8000033f800003;
  auVar83._12_4_ = 0x3f800003;
  auVar83._16_4_ = 0x3f800003;
  auVar83._20_4_ = 0x3f800003;
  auVar83._24_4_ = 0x3f800003;
  auVar83._28_4_ = 0x3f800003;
  auVar82 = vmulps_avx512vl(auVar82,auVar83);
  auVar80 = vpbroadcastd_avx512vl();
  uVar21 = vpcmpgtd_avx512vl(auVar80,_DAT_0205a920);
  uVar19 = vcmpps_avx512vl(local_200,auVar82,2);
  bVar43 = (byte)((byte)uVar19 & (byte)uVar21) == 0;
  local_5a1 = !bVar43;
  if (bVar43) {
    return local_5a1;
  }
  uVar41 = (ulong)(byte)((byte)uVar19 & (byte)uVar21);
  local_260 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
  auVar45 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
  auVar240 = ZEXT1664(auVar45);
  auVar45 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
  auVar242 = ZEXT1664(auVar45);
  auVar45 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
  auVar243 = ZEXT1664(auVar45);
  auVar45 = vxorps_avx512vl(in_ZMM31._0_16_,in_ZMM31._0_16_);
  auVar248 = ZEXT1664(auVar45);
LAB_01d9e347:
  lVar40 = 0;
  for (uVar35 = uVar41; (uVar35 & 1) == 0; uVar35 = uVar35 >> 1 | 0x8000000000000000) {
    lVar40 = lVar40 + 1;
  }
  uVar42 = *(uint *)(prim + 2);
  pGVar8 = (context->scene->geometries).items[uVar42].ptr;
  lVar9 = *(long *)&pGVar8[1].time_range.upper;
  uVar35 = (ulong)*(uint *)(*(long *)&pGVar8->field_0x58 +
                           (ulong)*(uint *)(prim + lVar40 * 4 + 6) *
                           pGVar8[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  auVar45 = *(undefined1 (*) [16])(lVar9 + (long)pGVar8[1].intersectionFilterN * uVar35);
  lVar40 = uVar35 + 1;
  auVar54 = *(undefined1 (*) [16])(lVar9 + (long)pGVar8[1].intersectionFilterN * lVar40);
  _Var10 = pGVar8[2].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  auVar4 = *(undefined1 (*) [16])(_Var10 + (long)pGVar8[2].userPtr * uVar35);
  auVar55 = *(undefined1 (*) [16])(_Var10 + (long)pGVar8[2].userPtr * lVar40);
  local_220 = vpbroadcastd_avx512vl();
  auVar56 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                          0x1c);
  auVar56 = vinsertps_avx(auVar56,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
  auVar46 = vbroadcastss_avx512vl(ZEXT416(0x3eaaaaab));
  auVar47 = vfmadd132ps_avx512vl
                      (*(undefined1 (*) [16])
                        (pGVar8[2].intersectionFilterN + (long)pGVar8[2].pointQueryFunc * uVar35),
                       auVar45,auVar46);
  auVar48 = vfnmadd132ps_avx512vl
                      (*(undefined1 (*) [16])
                        (pGVar8[2].intersectionFilterN + (long)pGVar8[2].pointQueryFunc * lVar40),
                       auVar54,auVar46);
  auVar49 = vfmadd132ps_avx512vl
                      (*(undefined1 (*) [16])
                        ((long)pGVar8[3].userPtr + uVar35 * *(long *)&pGVar8[3].fnumTimeSegments),
                       auVar4,auVar46);
  auVar50 = vfnmadd132ps_avx512vl
                      (*(undefined1 (*) [16])
                        ((long)pGVar8[3].userPtr + *(long *)&pGVar8[3].fnumTimeSegments * lVar40),
                       auVar55,auVar46);
  auVar115 = ZEXT816(0) << 0x40;
  auVar160._0_4_ = auVar54._0_4_ * 0.0;
  auVar160._4_4_ = auVar54._4_4_ * 0.0;
  auVar160._8_4_ = auVar54._8_4_ * 0.0;
  auVar160._12_4_ = auVar54._12_4_ * 0.0;
  auVar5 = vfmadd231ps_fma(auVar160,auVar48,auVar115);
  auVar51 = vfmadd213ps_fma(ZEXT816(0) << 0x40,auVar47,auVar5);
  auVar175._0_4_ = auVar51._0_4_ + auVar45._0_4_;
  auVar175._4_4_ = auVar51._4_4_ + auVar45._4_4_;
  auVar175._8_4_ = auVar51._8_4_ + auVar45._8_4_;
  auVar175._12_4_ = auVar51._12_4_ + auVar45._12_4_;
  auVar58 = auVar240._0_16_;
  auVar51 = vfmadd231ps_avx512vl(auVar5,auVar47,auVar58);
  auVar52 = vfnmadd231ps_avx512vl(auVar51,auVar45,auVar58);
  auVar219._0_4_ = auVar55._0_4_ * 0.0;
  auVar219._4_4_ = auVar55._4_4_ * 0.0;
  auVar219._8_4_ = auVar55._8_4_ * 0.0;
  auVar219._12_4_ = auVar55._12_4_ * 0.0;
  auVar5 = vfmadd231ps_fma(auVar219,auVar50,auVar115);
  auVar51 = vfmadd213ps_fma(ZEXT816(0) << 0x40,auVar49,auVar5);
  auVar229._0_4_ = auVar51._0_4_ + auVar4._0_4_;
  auVar229._4_4_ = auVar51._4_4_ + auVar4._4_4_;
  auVar229._8_4_ = auVar51._8_4_ + auVar4._8_4_;
  auVar229._12_4_ = auVar51._12_4_ + auVar4._12_4_;
  auVar51 = vfmadd231ps_avx512vl(auVar5,auVar49,auVar58);
  auVar53 = vfnmadd231ps_avx512vl(auVar51,auVar4,auVar58);
  auVar51 = vfmadd213ps_fma(ZEXT816(0) << 0x20,auVar48,auVar54);
  auVar51 = vfmadd231ps_fma(auVar51,auVar47,auVar115);
  auVar57 = vfmadd231ps_fma(auVar51,auVar45,auVar115);
  auVar54 = vmulps_avx512vl(auVar54,auVar58);
  auVar54 = vfnmadd231ps_avx512vl(auVar54,auVar58,auVar48);
  auVar54 = vfmadd231ps_fma(auVar54,auVar115,auVar47);
  auVar47 = vfnmadd231ps_fma(auVar54,auVar115,auVar45);
  auVar45 = vfmadd213ps_fma(ZEXT816(0) << 0x20,auVar50,auVar55);
  auVar45 = vfmadd231ps_fma(auVar45,auVar49,auVar115);
  auVar51 = vfmadd231ps_fma(auVar45,auVar4,auVar115);
  auVar45 = vmulps_avx512vl(auVar55,auVar58);
  auVar45 = vfnmadd231ps_avx512vl(auVar45,auVar58,auVar50);
  auVar45 = vfmadd231ps_fma(auVar45,auVar115,auVar49);
  auVar5 = vfnmadd231ps_fma(auVar45,auVar115,auVar4);
  auVar45 = vshufps_avx(auVar52,auVar52,0xc9);
  auVar54 = vshufps_avx(auVar229,auVar229,0xc9);
  fVar131 = auVar52._0_4_;
  auVar70._0_4_ = fVar131 * auVar54._0_4_;
  fVar172 = auVar52._4_4_;
  auVar70._4_4_ = fVar172 * auVar54._4_4_;
  fVar173 = auVar52._8_4_;
  auVar70._8_4_ = fVar173 * auVar54._8_4_;
  fVar174 = auVar52._12_4_;
  auVar70._12_4_ = fVar174 * auVar54._12_4_;
  auVar54 = vfmsub231ps_fma(auVar70,auVar45,auVar229);
  auVar4 = vshufps_avx(auVar54,auVar54,0xc9);
  auVar54 = vshufps_avx(auVar53,auVar53,0xc9);
  auVar75._0_4_ = fVar131 * auVar54._0_4_;
  auVar75._4_4_ = fVar172 * auVar54._4_4_;
  auVar75._8_4_ = fVar173 * auVar54._8_4_;
  auVar75._12_4_ = fVar174 * auVar54._12_4_;
  auVar45 = vfmsub231ps_fma(auVar75,auVar45,auVar53);
  auVar55 = vshufps_avx(auVar45,auVar45,0xc9);
  auVar45 = vshufps_avx(auVar47,auVar47,0xc9);
  auVar54 = vshufps_avx(auVar51,auVar51,0xc9);
  fVar1 = auVar47._0_4_;
  auVar192._0_4_ = auVar54._0_4_ * fVar1;
  fVar110 = auVar47._4_4_;
  auVar192._4_4_ = auVar54._4_4_ * fVar110;
  fVar206 = auVar47._8_4_;
  auVar192._8_4_ = auVar54._8_4_ * fVar206;
  fVar191 = auVar47._12_4_;
  auVar192._12_4_ = auVar54._12_4_ * fVar191;
  auVar54 = vfmsub231ps_fma(auVar192,auVar45,auVar51);
  auVar51 = vshufps_avx(auVar54,auVar54,0xc9);
  auVar54 = vshufps_avx(auVar5,auVar5,0xc9);
  auVar193._0_4_ = auVar54._0_4_ * fVar1;
  auVar193._4_4_ = auVar54._4_4_ * fVar110;
  auVar193._8_4_ = auVar54._8_4_ * fVar206;
  auVar193._12_4_ = auVar54._12_4_ * fVar191;
  auVar45 = vfmsub231ps_fma(auVar193,auVar45,auVar5);
  auVar5 = vshufps_avx(auVar45,auVar45,0xc9);
  auVar45 = vdpps_avx(auVar4,auVar4,0x7f);
  fVar204 = auVar45._0_4_;
  auVar194._4_12_ = ZEXT812(0) << 0x20;
  auVar194._0_4_ = fVar204;
  auVar54 = vrsqrt14ss_avx512f(auVar115,auVar194);
  auVar48 = vmulss_avx512f(auVar54,ZEXT416(0x3fc00000));
  auVar49 = vmulss_avx512f(auVar45,ZEXT416(0x3f000000));
  fVar205 = auVar54._0_4_;
  fVar113 = auVar48._0_4_ - auVar49._0_4_ * fVar205 * fVar205 * fVar205;
  fVar218 = fVar113 * auVar4._0_4_;
  fVar226 = fVar113 * auVar4._4_4_;
  fVar227 = fVar113 * auVar4._8_4_;
  fVar228 = fVar113 * auVar4._12_4_;
  auVar54 = vdpps_avx(auVar4,auVar55,0x7f);
  auVar68._0_4_ = fVar204 * auVar55._0_4_;
  auVar68._4_4_ = fVar204 * auVar55._4_4_;
  auVar68._8_4_ = fVar204 * auVar55._8_4_;
  auVar68._12_4_ = fVar204 * auVar55._12_4_;
  fVar204 = auVar54._0_4_;
  auVar65._0_4_ = fVar204 * auVar4._0_4_;
  auVar65._4_4_ = fVar204 * auVar4._4_4_;
  auVar65._8_4_ = fVar204 * auVar4._8_4_;
  auVar65._12_4_ = fVar204 * auVar4._12_4_;
  auVar4 = vsubps_avx(auVar68,auVar65);
  auVar54 = vrcp14ss_avx512f(auVar115,auVar194);
  auVar45 = vfnmadd213ss_avx512f(auVar45,auVar54,ZEXT416(0x40000000));
  fVar204 = auVar54._0_4_ * auVar45._0_4_;
  auVar45 = vdpps_avx(auVar51,auVar51,0x7f);
  fVar205 = auVar45._0_4_;
  auVar66._4_12_ = ZEXT812(0) << 0x20;
  auVar66._0_4_ = fVar205;
  auVar54 = vrsqrt14ss_avx512f(auVar115,auVar66);
  auVar55 = vmulss_avx512f(auVar54,ZEXT416(0x3fc00000));
  auVar48 = vmulss_avx512f(auVar45,ZEXT416(0x3f000000));
  fVar114 = auVar54._0_4_;
  fVar114 = auVar55._0_4_ - auVar48._0_4_ * fVar114 * fVar114 * fVar114;
  fVar207 = fVar114 * auVar51._0_4_;
  fVar215 = fVar114 * auVar51._4_4_;
  fVar216 = fVar114 * auVar51._8_4_;
  fVar217 = fVar114 * auVar51._12_4_;
  auVar54 = vdpps_avx(auVar51,auVar5,0x7f);
  auVar58._0_4_ = fVar205 * auVar5._0_4_;
  auVar58._4_4_ = fVar205 * auVar5._4_4_;
  auVar58._8_4_ = fVar205 * auVar5._8_4_;
  auVar58._12_4_ = fVar205 * auVar5._12_4_;
  fVar205 = auVar54._0_4_;
  auVar48._0_4_ = fVar205 * auVar51._0_4_;
  auVar48._4_4_ = fVar205 * auVar51._4_4_;
  auVar48._8_4_ = fVar205 * auVar51._8_4_;
  auVar48._12_4_ = fVar205 * auVar51._12_4_;
  auVar55 = vsubps_avx(auVar58,auVar48);
  auVar54 = vrcp14ss_avx512f(auVar115,auVar66);
  auVar45 = vfnmadd213ss_avx512f(auVar45,auVar54,ZEXT416(0x40000000));
  fVar205 = auVar54._0_4_ * auVar45._0_4_;
  auVar45 = vshufps_avx(auVar175,auVar175,0xff);
  auVar67._0_4_ = fVar218 * auVar45._0_4_;
  auVar67._4_4_ = fVar226 * auVar45._4_4_;
  auVar67._8_4_ = fVar227 * auVar45._8_4_;
  auVar67._12_4_ = fVar228 * auVar45._12_4_;
  local_310 = vsubps_avx(auVar175,auVar67);
  auVar54 = vshufps_avx(auVar52,auVar52,0xff);
  auVar59._0_4_ = fVar218 * auVar54._0_4_ + auVar45._0_4_ * fVar113 * auVar4._0_4_ * fVar204;
  auVar59._4_4_ = fVar226 * auVar54._4_4_ + auVar45._4_4_ * fVar113 * auVar4._4_4_ * fVar204;
  auVar59._8_4_ = fVar227 * auVar54._8_4_ + auVar45._8_4_ * fVar113 * auVar4._8_4_ * fVar204;
  auVar59._12_4_ = fVar228 * auVar54._12_4_ + auVar45._12_4_ * fVar113 * auVar4._12_4_ * fVar204;
  auVar4 = vsubps_avx(auVar52,auVar59);
  local_320._0_4_ = auVar175._0_4_ + auVar67._0_4_;
  local_320._4_4_ = auVar175._4_4_ + auVar67._4_4_;
  fStack_318 = auVar175._8_4_ + auVar67._8_4_;
  fStack_314 = auVar175._12_4_ + auVar67._12_4_;
  auVar60._0_4_ = fVar131 + auVar59._0_4_;
  auVar60._4_4_ = fVar172 + auVar59._4_4_;
  auVar60._8_4_ = fVar173 + auVar59._8_4_;
  auVar60._12_4_ = fVar174 + auVar59._12_4_;
  auVar45 = vshufps_avx(auVar57,auVar57,0xff);
  auVar69._0_4_ = fVar207 * auVar45._0_4_;
  auVar69._4_4_ = fVar215 * auVar45._4_4_;
  auVar69._8_4_ = fVar216 * auVar45._8_4_;
  auVar69._12_4_ = fVar217 * auVar45._12_4_;
  local_330 = vsubps_avx(auVar57,auVar69);
  auVar54 = vshufps_avx(auVar47,auVar47,0xff);
  auVar49._0_4_ = fVar207 * auVar54._0_4_ + auVar45._0_4_ * fVar114 * auVar55._0_4_ * fVar205;
  auVar49._4_4_ = fVar215 * auVar54._4_4_ + auVar45._4_4_ * fVar114 * auVar55._4_4_ * fVar205;
  auVar49._8_4_ = fVar216 * auVar54._8_4_ + auVar45._8_4_ * fVar114 * auVar55._8_4_ * fVar205;
  auVar49._12_4_ = fVar217 * auVar54._12_4_ + auVar45._12_4_ * fVar114 * auVar55._12_4_ * fVar205;
  auVar45 = vsubps_avx(auVar47,auVar49);
  _local_340 = vaddps_avx512vl(auVar57,auVar69);
  auVar50._0_4_ = fVar1 + auVar49._0_4_;
  auVar50._4_4_ = fVar110 + auVar49._4_4_;
  auVar50._8_4_ = fVar206 + auVar49._8_4_;
  auVar50._12_4_ = fVar191 + auVar49._12_4_;
  auVar54 = vmulps_avx512vl(auVar4,auVar46);
  local_350 = vaddps_avx512vl(local_310,auVar54);
  auVar45 = vmulps_avx512vl(auVar45,auVar46);
  local_360 = vsubps_avx512vl(local_330,auVar45);
  auVar45 = vmulps_avx512vl(auVar60,auVar46);
  _local_370 = vaddps_avx512vl(_local_320,auVar45);
  auVar45 = vmulps_avx512vl(auVar50,auVar46);
  _local_380 = vsubps_avx512vl(_local_340,auVar45);
  local_290 = vsubps_avx(local_310,auVar56);
  uVar111 = local_290._0_4_;
  auVar52._4_4_ = uVar111;
  auVar52._0_4_ = uVar111;
  auVar52._8_4_ = uVar111;
  auVar52._12_4_ = uVar111;
  auVar45 = vshufps_avx(local_290,local_290,0x55);
  auVar54 = vshufps_avx(local_290,local_290,0xaa);
  aVar2 = pre->ray_space[k].vx.field_0;
  aVar3 = pre->ray_space[k].vy.field_0;
  fVar1 = pre->ray_space[k].vz.field_0.m128[0];
  fVar110 = pre->ray_space[k].vz.field_0.m128[1];
  fVar206 = pre->ray_space[k].vz.field_0.m128[2];
  fVar191 = pre->ray_space[k].vz.field_0.m128[3];
  auVar46._0_4_ = fVar1 * auVar54._0_4_;
  auVar46._4_4_ = fVar110 * auVar54._4_4_;
  auVar46._8_4_ = fVar206 * auVar54._8_4_;
  auVar46._12_4_ = fVar191 * auVar54._12_4_;
  auVar45 = vfmadd231ps_fma(auVar46,(undefined1  [16])aVar3,auVar45);
  auVar57 = vfmadd231ps_fma(auVar45,(undefined1  [16])aVar2,auVar52);
  local_2a0 = vsubps_avx512vl(local_350,auVar56);
  uVar111 = local_2a0._0_4_;
  auVar61._4_4_ = uVar111;
  auVar61._0_4_ = uVar111;
  auVar61._8_4_ = uVar111;
  auVar61._12_4_ = uVar111;
  auVar45 = vshufps_avx(local_2a0,local_2a0,0x55);
  auVar54 = vshufps_avx(local_2a0,local_2a0,0xaa);
  auVar53._0_4_ = fVar1 * auVar54._0_4_;
  auVar53._4_4_ = fVar110 * auVar54._4_4_;
  auVar53._8_4_ = fVar206 * auVar54._8_4_;
  auVar53._12_4_ = fVar191 * auVar54._12_4_;
  auVar45 = vfmadd231ps_fma(auVar53,(undefined1  [16])aVar3,auVar45);
  auVar47 = vfmadd231ps_fma(auVar45,(undefined1  [16])aVar2,auVar61);
  local_2b0 = vsubps_avx512vl(local_360,auVar56);
  uVar111 = local_2b0._0_4_;
  auVar64._4_4_ = uVar111;
  auVar64._0_4_ = uVar111;
  auVar64._8_4_ = uVar111;
  auVar64._12_4_ = uVar111;
  auVar45 = vshufps_avx(local_2b0,local_2b0,0x55);
  auVar54 = vshufps_avx(local_2b0,local_2b0,0xaa);
  auVar176._0_4_ = auVar54._0_4_ * fVar1;
  auVar176._4_4_ = auVar54._4_4_ * fVar110;
  auVar176._8_4_ = auVar54._8_4_ * fVar206;
  auVar176._12_4_ = auVar54._12_4_ * fVar191;
  auVar45 = vfmadd231ps_fma(auVar176,(undefined1  [16])aVar3,auVar45);
  auVar46 = vfmadd231ps_fma(auVar45,(undefined1  [16])aVar2,auVar64);
  local_2c0 = vsubps_avx(local_330,auVar56);
  uVar111 = local_2c0._0_4_;
  auVar62._4_4_ = uVar111;
  auVar62._0_4_ = uVar111;
  auVar62._8_4_ = uVar111;
  auVar62._12_4_ = uVar111;
  auVar45 = vshufps_avx(local_2c0,local_2c0,0x55);
  auVar54 = vshufps_avx(local_2c0,local_2c0,0xaa);
  auVar184._0_4_ = auVar54._0_4_ * fVar1;
  auVar184._4_4_ = auVar54._4_4_ * fVar110;
  auVar184._8_4_ = auVar54._8_4_ * fVar206;
  auVar184._12_4_ = auVar54._12_4_ * fVar191;
  auVar45 = vfmadd231ps_fma(auVar184,(undefined1  [16])aVar3,auVar45);
  auVar48 = vfmadd231ps_fma(auVar45,(undefined1  [16])aVar2,auVar62);
  local_2d0 = vsubps_avx(_local_320,auVar56);
  uVar111 = local_2d0._0_4_;
  auVar74._4_4_ = uVar111;
  auVar74._0_4_ = uVar111;
  auVar74._8_4_ = uVar111;
  auVar74._12_4_ = uVar111;
  auVar45 = vshufps_avx(local_2d0,local_2d0,0x55);
  auVar54 = vshufps_avx(local_2d0,local_2d0,0xaa);
  auVar195._0_4_ = auVar54._0_4_ * fVar1;
  auVar195._4_4_ = auVar54._4_4_ * fVar110;
  auVar195._8_4_ = auVar54._8_4_ * fVar206;
  auVar195._12_4_ = auVar54._12_4_ * fVar191;
  auVar45 = vfmadd231ps_fma(auVar195,(undefined1  [16])aVar3,auVar45);
  auVar49 = vfmadd231ps_fma(auVar45,(undefined1  [16])aVar2,auVar74);
  local_2e0 = vsubps_avx512vl(_local_370,auVar56);
  uVar111 = local_2e0._0_4_;
  auVar63._4_4_ = uVar111;
  auVar63._0_4_ = uVar111;
  auVar63._8_4_ = uVar111;
  auVar63._12_4_ = uVar111;
  auVar45 = vshufps_avx(local_2e0,local_2e0,0x55);
  auVar54 = vshufps_avx(local_2e0,local_2e0,0xaa);
  auVar208._0_4_ = auVar54._0_4_ * fVar1;
  auVar208._4_4_ = auVar54._4_4_ * fVar110;
  auVar208._8_4_ = auVar54._8_4_ * fVar206;
  auVar208._12_4_ = auVar54._12_4_ * fVar191;
  auVar45 = vfmadd231ps_fma(auVar208,(undefined1  [16])aVar3,auVar45);
  auVar50 = vfmadd231ps_fma(auVar45,(undefined1  [16])aVar2,auVar63);
  local_2f0 = vsubps_avx512vl(_local_380,auVar56);
  uVar111 = local_2f0._0_4_;
  auVar71._4_4_ = uVar111;
  auVar71._0_4_ = uVar111;
  auVar71._8_4_ = uVar111;
  auVar71._12_4_ = uVar111;
  auVar45 = vshufps_avx(local_2f0,local_2f0,0x55);
  auVar54 = vshufps_avx(local_2f0,local_2f0,0xaa);
  auVar220._0_4_ = auVar54._0_4_ * fVar1;
  auVar220._4_4_ = auVar54._4_4_ * fVar110;
  auVar220._8_4_ = auVar54._8_4_ * fVar206;
  auVar220._12_4_ = auVar54._12_4_ * fVar191;
  auVar45 = vfmadd231ps_fma(auVar220,(undefined1  [16])aVar3,auVar45);
  auVar52 = vfmadd231ps_fma(auVar45,(undefined1  [16])aVar2,auVar71);
  local_300 = vsubps_avx512vl(_local_340,auVar56);
  uVar111 = local_300._0_4_;
  auVar72._4_4_ = uVar111;
  auVar72._0_4_ = uVar111;
  auVar72._8_4_ = uVar111;
  auVar72._12_4_ = uVar111;
  auVar45 = vshufps_avx(local_300,local_300,0x55);
  auVar54 = vshufps_avx(local_300,local_300,0xaa);
  auVar73._0_4_ = fVar1 * auVar54._0_4_;
  auVar73._4_4_ = fVar110 * auVar54._4_4_;
  auVar73._8_4_ = fVar206 * auVar54._8_4_;
  auVar73._12_4_ = fVar191 * auVar54._12_4_;
  auVar45 = vfmadd231ps_fma(auVar73,(undefined1  [16])aVar3,auVar45);
  auVar53 = vfmadd231ps_fma(auVar45,(undefined1  [16])aVar2,auVar72);
  auVar4 = vmovlhps_avx(auVar57,auVar49);
  auVar55 = vmovlhps_avx(auVar47,auVar50);
  auVar51 = vmovlhps_avx512f(auVar46,auVar52);
  auVar5 = vmovlhps_avx512f(auVar48,auVar53);
  auVar54 = vminps_avx(auVar4,auVar55);
  auVar45 = vmaxps_avx(auVar4,auVar55);
  auVar56 = vminps_avx512vl(auVar51,auVar5);
  auVar54 = vminps_avx(auVar54,auVar56);
  auVar56 = vmaxps_avx512vl(auVar51,auVar5);
  auVar45 = vmaxps_avx(auVar45,auVar56);
  auVar56 = vshufpd_avx(auVar54,auVar54,3);
  auVar54 = vminps_avx(auVar54,auVar56);
  auVar56 = vshufpd_avx(auVar45,auVar45,3);
  auVar45 = vmaxps_avx(auVar45,auVar56);
  auVar54 = vandps_avx512vl(auVar54,auVar242._0_16_);
  auVar45 = vandps_avx512vl(auVar45,auVar242._0_16_);
  auVar45 = vmaxps_avx(auVar54,auVar45);
  auVar54 = vmovshdup_avx(auVar45);
  auVar45 = vmaxss_avx(auVar54,auVar45);
  fVar110 = auVar45._0_4_ * 9.536743e-07;
  auVar56 = vmovddup_avx512vl(auVar57);
  auVar57 = vmovddup_avx512vl(auVar47);
  auVar115._8_8_ = auVar46._0_8_;
  auVar115._0_8_ = auVar46._0_8_;
  auVar132._8_8_ = auVar48._0_8_;
  auVar132._0_8_ = auVar48._0_8_;
  local_1c0 = vbroadcastss_avx512vl(ZEXT416((uint)fVar110));
  auVar45 = vxorps_avx512vl(local_1c0._0_16_,auVar243._0_16_);
  local_1e0 = vbroadcastss_avx512vl(auVar45);
  bVar43 = false;
  uVar35 = 0;
  fVar1 = *(float *)(ray + k * 4 + 0x60);
  auVar45 = vsubps_avx(auVar55,auVar4);
  auVar47 = vsubps_avx512vl(auVar51,auVar55);
  auVar46 = vsubps_avx512vl(auVar5,auVar51);
  local_390 = vsubps_avx(_local_320,local_310);
  local_3a0 = vsubps_avx512vl(_local_370,local_350);
  local_3b0 = vsubps_avx512vl(_local_380,local_360);
  _local_3c0 = vsubps_avx512vl(_local_340,local_330);
  local_240 = vpbroadcastd_avx512vl();
  auVar54 = ZEXT816(0x3f80000000000000);
  auVar239 = ZEXT1664(auVar54);
  do {
    auVar74 = auVar239._0_16_;
    auVar48 = vshufps_avx(auVar74,auVar74,0x50);
    auVar83 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
    auVar58 = vsubps_avx512vl(auVar83._0_16_,auVar48);
    fVar206 = auVar48._0_4_;
    fVar217 = auVar49._0_4_;
    auVar133._0_4_ = fVar217 * fVar206;
    fVar191 = auVar48._4_4_;
    fVar218 = auVar49._4_4_;
    auVar133._4_4_ = fVar218 * fVar191;
    fVar204 = auVar48._8_4_;
    auVar133._8_4_ = fVar217 * fVar204;
    fVar205 = auVar48._12_4_;
    auVar133._12_4_ = fVar218 * fVar205;
    fVar113 = auVar50._0_4_;
    auVar142._0_4_ = fVar113 * fVar206;
    fVar114 = auVar50._4_4_;
    auVar142._4_4_ = fVar114 * fVar191;
    auVar142._8_4_ = fVar113 * fVar204;
    auVar142._12_4_ = fVar114 * fVar205;
    fVar131 = auVar52._0_4_;
    auVar149._0_4_ = fVar131 * fVar206;
    fVar172 = auVar52._4_4_;
    auVar149._4_4_ = fVar172 * fVar191;
    auVar149._8_4_ = fVar131 * fVar204;
    auVar149._12_4_ = fVar172 * fVar205;
    fVar173 = auVar53._0_4_;
    auVar116._0_4_ = fVar173 * fVar206;
    fVar174 = auVar53._4_4_;
    auVar116._4_4_ = fVar174 * fVar191;
    auVar116._8_4_ = fVar173 * fVar204;
    auVar116._12_4_ = fVar174 * fVar205;
    auVar59 = vfmadd231ps_avx512vl(auVar133,auVar58,auVar56);
    auVar60 = vfmadd231ps_avx512vl(auVar142,auVar58,auVar57);
    auVar61 = vfmadd231ps_avx512vl(auVar149,auVar58,auVar115);
    auVar58 = vfmadd231ps_fma(auVar116,auVar132,auVar58);
    auVar48 = vmovshdup_avx(auVar54);
    fVar191 = auVar54._0_4_;
    fVar206 = (auVar48._0_4_ - fVar191) * 0.04761905;
    auVar171._4_4_ = fVar191;
    auVar171._0_4_ = fVar191;
    auVar171._8_4_ = fVar191;
    auVar171._12_4_ = fVar191;
    auVar171._16_4_ = fVar191;
    auVar171._20_4_ = fVar191;
    auVar171._24_4_ = fVar191;
    auVar171._28_4_ = fVar191;
    auVar128._0_8_ = auVar48._0_8_;
    auVar128._8_8_ = auVar128._0_8_;
    auVar128._16_8_ = auVar128._0_8_;
    auVar128._24_8_ = auVar128._0_8_;
    auVar82 = vsubps_avx(auVar128,auVar171);
    uVar111 = auVar59._0_4_;
    auVar129._4_4_ = uVar111;
    auVar129._0_4_ = uVar111;
    auVar129._8_4_ = uVar111;
    auVar129._12_4_ = uVar111;
    auVar129._16_4_ = uVar111;
    auVar129._20_4_ = uVar111;
    auVar129._24_4_ = uVar111;
    auVar129._28_4_ = uVar111;
    auVar188._8_4_ = 1;
    auVar188._0_8_ = 0x100000001;
    auVar188._12_4_ = 1;
    auVar188._16_4_ = 1;
    auVar188._20_4_ = 1;
    auVar188._24_4_ = 1;
    auVar188._28_4_ = 1;
    auVar81 = ZEXT1632(auVar59);
    auVar80 = vpermps_avx2(auVar188,auVar81);
    auVar84 = vbroadcastss_avx512vl(auVar60);
    auVar93 = ZEXT1632(auVar60);
    auVar85 = vpermps_avx512vl(auVar188,auVar93);
    auVar86 = vbroadcastss_avx512vl(auVar61);
    auVar90 = ZEXT1632(auVar61);
    auVar87 = vpermps_avx512vl(auVar188,auVar90);
    auVar88 = vbroadcastss_avx512vl(auVar58);
    auVar91 = ZEXT1632(auVar58);
    auVar78 = vpermps_avx512vl(auVar188,auVar91);
    auVar189._4_4_ = fVar206;
    auVar189._0_4_ = fVar206;
    auVar189._8_4_ = fVar206;
    auVar189._12_4_ = fVar206;
    auVar189._16_4_ = fVar206;
    auVar189._20_4_ = fVar206;
    auVar189._24_4_ = fVar206;
    auVar189._28_4_ = fVar206;
    auVar92 = auVar246._0_32_;
    auVar79 = vpermps_avx512vl(auVar92,auVar81);
    auVar158._8_4_ = 3;
    auVar158._0_8_ = 0x300000003;
    auVar158._12_4_ = 3;
    auVar158._16_4_ = 3;
    auVar158._20_4_ = 3;
    auVar158._24_4_ = 3;
    auVar158._28_4_ = 3;
    auVar89 = vpermps_avx512vl(auVar158,auVar81);
    auVar76 = vpermps_avx512vl(auVar92,auVar93);
    auVar81 = vpermps_avx2(auVar158,auVar93);
    auVar77 = vpermps_avx512vl(auVar92,auVar90);
    auVar93 = vpermps_avx2(auVar158,auVar90);
    auVar90 = vpermps_avx512vl(auVar92,auVar91);
    auVar91 = vpermps_avx512vl(auVar158,auVar91);
    auVar48 = vfmadd132ps_fma(auVar82,auVar171,_DAT_02020f20);
    auVar83 = vsubps_avx512vl(auVar83,ZEXT1632(auVar48));
    auVar82 = vmulps_avx512vl(auVar84,ZEXT1632(auVar48));
    auVar94 = ZEXT1632(auVar48);
    auVar92 = vmulps_avx512vl(auVar85,auVar94);
    auVar58 = vfmadd231ps_fma(auVar82,auVar83,auVar129);
    auVar59 = vfmadd231ps_fma(auVar92,auVar83,auVar80);
    auVar82 = vmulps_avx512vl(auVar86,auVar94);
    auVar92 = vmulps_avx512vl(auVar87,auVar94);
    auVar82 = vfmadd231ps_avx512vl(auVar82,auVar83,auVar84);
    auVar84 = vfmadd231ps_avx512vl(auVar92,auVar83,auVar85);
    auVar85 = vmulps_avx512vl(auVar88,auVar94);
    auVar92 = ZEXT1632(auVar48);
    auVar78 = vmulps_avx512vl(auVar78,auVar92);
    auVar85 = vfmadd231ps_avx512vl(auVar85,auVar83,auVar86);
    auVar86 = vfmadd231ps_avx512vl(auVar78,auVar83,auVar87);
    fVar204 = auVar48._0_4_;
    fVar205 = auVar48._4_4_;
    auVar24._4_4_ = fVar205 * auVar82._4_4_;
    auVar24._0_4_ = fVar204 * auVar82._0_4_;
    fVar207 = auVar48._8_4_;
    auVar24._8_4_ = fVar207 * auVar82._8_4_;
    fVar215 = auVar48._12_4_;
    auVar24._12_4_ = fVar215 * auVar82._12_4_;
    auVar24._16_4_ = auVar82._16_4_ * 0.0;
    auVar24._20_4_ = auVar82._20_4_ * 0.0;
    auVar24._24_4_ = auVar82._24_4_ * 0.0;
    auVar24._28_4_ = fVar191;
    auVar25._4_4_ = fVar205 * auVar84._4_4_;
    auVar25._0_4_ = fVar204 * auVar84._0_4_;
    auVar25._8_4_ = fVar207 * auVar84._8_4_;
    auVar25._12_4_ = fVar215 * auVar84._12_4_;
    auVar25._16_4_ = auVar84._16_4_ * 0.0;
    auVar25._20_4_ = auVar84._20_4_ * 0.0;
    auVar25._24_4_ = auVar84._24_4_ * 0.0;
    auVar25._28_4_ = auVar80._28_4_;
    auVar58 = vfmadd231ps_fma(auVar24,auVar83,ZEXT1632(auVar58));
    auVar59 = vfmadd231ps_fma(auVar25,auVar83,ZEXT1632(auVar59));
    auVar122._0_4_ = fVar204 * auVar85._0_4_;
    auVar122._4_4_ = fVar205 * auVar85._4_4_;
    auVar122._8_4_ = fVar207 * auVar85._8_4_;
    auVar122._12_4_ = fVar215 * auVar85._12_4_;
    auVar122._16_4_ = auVar85._16_4_ * 0.0;
    auVar122._20_4_ = auVar85._20_4_ * 0.0;
    auVar122._24_4_ = auVar85._24_4_ * 0.0;
    auVar122._28_4_ = 0;
    auVar26._4_4_ = fVar205 * auVar86._4_4_;
    auVar26._0_4_ = fVar204 * auVar86._0_4_;
    auVar26._8_4_ = fVar207 * auVar86._8_4_;
    auVar26._12_4_ = fVar215 * auVar86._12_4_;
    auVar26._16_4_ = auVar86._16_4_ * 0.0;
    auVar26._20_4_ = auVar86._20_4_ * 0.0;
    auVar26._24_4_ = auVar86._24_4_ * 0.0;
    auVar26._28_4_ = auVar85._28_4_;
    auVar60 = vfmadd231ps_fma(auVar122,auVar83,auVar82);
    auVar61 = vfmadd231ps_fma(auVar26,auVar83,auVar84);
    auVar27._28_4_ = auVar84._28_4_;
    auVar27._0_28_ =
         ZEXT1628(CONCAT412(fVar215 * auVar61._12_4_,
                            CONCAT48(fVar207 * auVar61._8_4_,
                                     CONCAT44(fVar205 * auVar61._4_4_,fVar204 * auVar61._0_4_))));
    auVar64 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar215 * auVar60._12_4_,
                                                 CONCAT48(fVar207 * auVar60._8_4_,
                                                          CONCAT44(fVar205 * auVar60._4_4_,
                                                                   fVar204 * auVar60._0_4_)))),
                              auVar83,ZEXT1632(auVar58));
    auVar62 = vfmadd231ps_fma(auVar27,auVar83,ZEXT1632(auVar59));
    auVar82 = vsubps_avx(ZEXT1632(auVar60),ZEXT1632(auVar58));
    auVar80 = vsubps_avx(ZEXT1632(auVar61),ZEXT1632(auVar59));
    auVar84 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
    auVar82 = vmulps_avx512vl(auVar82,auVar84);
    auVar80 = vmulps_avx512vl(auVar80,auVar84);
    auVar183._0_4_ = fVar206 * auVar82._0_4_;
    auVar183._4_4_ = fVar206 * auVar82._4_4_;
    auVar183._8_4_ = fVar206 * auVar82._8_4_;
    auVar183._12_4_ = fVar206 * auVar82._12_4_;
    auVar183._16_4_ = fVar206 * auVar82._16_4_;
    auVar183._20_4_ = fVar206 * auVar82._20_4_;
    auVar183._24_4_ = fVar206 * auVar82._24_4_;
    auVar183._28_4_ = 0;
    auVar82 = vmulps_avx512vl(auVar189,auVar80);
    auVar60 = vxorps_avx512vl(auVar88._0_16_,auVar88._0_16_);
    auVar85 = vpermt2ps_avx512vl(ZEXT1632(auVar64),_DAT_0205fd20,ZEXT1632(auVar60));
    auVar86 = vpermt2ps_avx512vl(ZEXT1632(auVar62),_DAT_0205fd20,ZEXT1632(auVar60));
    auVar123._0_4_ = auVar183._0_4_ + auVar64._0_4_;
    auVar123._4_4_ = auVar183._4_4_ + auVar64._4_4_;
    auVar123._8_4_ = auVar183._8_4_ + auVar64._8_4_;
    auVar123._12_4_ = auVar183._12_4_ + auVar64._12_4_;
    auVar123._16_4_ = auVar183._16_4_ + 0.0;
    auVar123._20_4_ = auVar183._20_4_ + 0.0;
    auVar123._24_4_ = auVar183._24_4_ + 0.0;
    auVar123._28_4_ = 0;
    auVar94 = ZEXT1632(auVar60);
    auVar80 = vpermt2ps_avx512vl(auVar183,_DAT_0205fd20,auVar94);
    auVar87 = vaddps_avx512vl(ZEXT1632(auVar62),auVar82);
    auVar88 = vpermt2ps_avx512vl(auVar82,_DAT_0205fd20,auVar94);
    auVar82 = vsubps_avx(auVar85,auVar80);
    auVar88 = vsubps_avx512vl(auVar86,auVar88);
    auVar80 = vmulps_avx512vl(auVar76,auVar92);
    auVar78 = vmulps_avx512vl(auVar81,auVar92);
    auVar80 = vfmadd231ps_avx512vl(auVar80,auVar83,auVar79);
    auVar78 = vfmadd231ps_avx512vl(auVar78,auVar83,auVar89);
    auVar79 = vmulps_avx512vl(auVar77,auVar92);
    auVar89 = vmulps_avx512vl(auVar93,auVar92);
    auVar79 = vfmadd231ps_avx512vl(auVar79,auVar83,auVar76);
    auVar81 = vfmadd231ps_avx512vl(auVar89,auVar83,auVar81);
    auVar89 = vmulps_avx512vl(auVar90,auVar92);
    auVar76 = vmulps_avx512vl(auVar91,auVar92);
    auVar58 = vfmadd231ps_fma(auVar89,auVar83,auVar77);
    auVar59 = vfmadd231ps_fma(auVar76,auVar83,auVar93);
    auVar89 = vmulps_avx512vl(auVar92,auVar79);
    auVar76 = vmulps_avx512vl(ZEXT1632(auVar48),auVar81);
    auVar80 = vfmadd231ps_avx512vl(auVar89,auVar83,auVar80);
    auVar78 = vfmadd231ps_avx512vl(auVar76,auVar83,auVar78);
    auVar79 = vfmadd231ps_avx512vl
                        (ZEXT1632(CONCAT412(fVar215 * auVar58._12_4_,
                                            CONCAT48(fVar207 * auVar58._8_4_,
                                                     CONCAT44(fVar205 * auVar58._4_4_,
                                                              fVar204 * auVar58._0_4_)))),auVar83,
                         auVar79);
    auVar81 = vfmadd231ps_avx512vl
                        (ZEXT1632(CONCAT412(fVar215 * auVar59._12_4_,
                                            CONCAT48(fVar207 * auVar59._8_4_,
                                                     CONCAT44(fVar205 * auVar59._4_4_,
                                                              fVar204 * auVar59._0_4_)))),auVar83,
                         auVar81);
    auVar28._4_4_ = fVar205 * auVar79._4_4_;
    auVar28._0_4_ = fVar204 * auVar79._0_4_;
    auVar28._8_4_ = fVar207 * auVar79._8_4_;
    auVar28._12_4_ = fVar215 * auVar79._12_4_;
    auVar28._16_4_ = auVar79._16_4_ * 0.0;
    auVar28._20_4_ = auVar79._20_4_ * 0.0;
    auVar28._24_4_ = auVar79._24_4_ * 0.0;
    auVar28._28_4_ = auVar93._28_4_;
    auVar29._4_4_ = fVar205 * auVar81._4_4_;
    auVar29._0_4_ = fVar204 * auVar81._0_4_;
    auVar29._8_4_ = fVar207 * auVar81._8_4_;
    auVar29._12_4_ = fVar215 * auVar81._12_4_;
    auVar29._16_4_ = auVar81._16_4_ * 0.0;
    auVar29._20_4_ = auVar81._20_4_ * 0.0;
    auVar29._24_4_ = auVar81._24_4_ * 0.0;
    auVar29._28_4_ = auVar77._28_4_;
    auVar93 = vfmadd231ps_avx512vl(auVar28,auVar83,auVar80);
    auVar83 = vfmadd231ps_avx512vl(auVar29,auVar78,auVar83);
    auVar80 = vsubps_avx512vl(auVar79,auVar80);
    auVar81 = vsubps_avx512vl(auVar81,auVar78);
    auVar80 = vmulps_avx512vl(auVar80,auVar84);
    auVar81 = vmulps_avx512vl(auVar81,auVar84);
    fVar191 = fVar206 * auVar80._0_4_;
    fVar204 = fVar206 * auVar80._4_4_;
    auVar30._4_4_ = fVar204;
    auVar30._0_4_ = fVar191;
    fVar205 = fVar206 * auVar80._8_4_;
    auVar30._8_4_ = fVar205;
    fVar207 = fVar206 * auVar80._12_4_;
    auVar30._12_4_ = fVar207;
    fVar215 = fVar206 * auVar80._16_4_;
    auVar30._16_4_ = fVar215;
    fVar216 = fVar206 * auVar80._20_4_;
    auVar30._20_4_ = fVar216;
    fVar206 = fVar206 * auVar80._24_4_;
    auVar30._24_4_ = fVar206;
    auVar30._28_4_ = auVar80._28_4_;
    auVar81 = vmulps_avx512vl(auVar189,auVar81);
    auVar84 = vpermt2ps_avx512vl(auVar93,_DAT_0205fd20,auVar94);
    auVar78 = vpermt2ps_avx512vl(auVar83,_DAT_0205fd20,auVar94);
    auVar190._0_4_ = auVar93._0_4_ + fVar191;
    auVar190._4_4_ = auVar93._4_4_ + fVar204;
    auVar190._8_4_ = auVar93._8_4_ + fVar205;
    auVar190._12_4_ = auVar93._12_4_ + fVar207;
    auVar190._16_4_ = auVar93._16_4_ + fVar215;
    auVar190._20_4_ = auVar93._20_4_ + fVar216;
    auVar190._24_4_ = auVar93._24_4_ + fVar206;
    auVar190._28_4_ = auVar93._28_4_ + auVar80._28_4_;
    auVar80 = vpermt2ps_avx512vl(auVar30,_DAT_0205fd20,ZEXT1632(auVar60));
    auVar79 = vaddps_avx512vl(auVar83,auVar81);
    auVar81 = vpermt2ps_avx512vl(auVar81,_DAT_0205fd20,ZEXT1632(auVar60));
    auVar80 = vsubps_avx(auVar84,auVar80);
    auVar81 = vsubps_avx512vl(auVar78,auVar81);
    auVar139 = ZEXT1632(auVar64);
    auVar89 = vsubps_avx512vl(auVar93,auVar139);
    auVar146 = ZEXT1632(auVar62);
    auVar76 = vsubps_avx512vl(auVar83,auVar146);
    auVar77 = vsubps_avx512vl(auVar84,auVar85);
    auVar89 = vaddps_avx512vl(auVar89,auVar77);
    auVar77 = vsubps_avx512vl(auVar78,auVar86);
    auVar76 = vaddps_avx512vl(auVar76,auVar77);
    auVar77 = vmulps_avx512vl(auVar146,auVar89);
    auVar77 = vfnmadd231ps_avx512vl(auVar77,auVar139,auVar76);
    auVar90 = vmulps_avx512vl(auVar87,auVar89);
    auVar90 = vfnmadd231ps_avx512vl(auVar90,auVar123,auVar76);
    auVar91 = vmulps_avx512vl(auVar88,auVar89);
    auVar91 = vfnmadd231ps_avx512vl(auVar91,auVar82,auVar76);
    auVar92 = vmulps_avx512vl(auVar86,auVar89);
    auVar92 = vfnmadd231ps_avx512vl(auVar92,auVar85,auVar76);
    auVar94 = vmulps_avx512vl(auVar83,auVar89);
    auVar94 = vfnmadd231ps_avx512vl(auVar94,auVar93,auVar76);
    auVar95 = vmulps_avx512vl(auVar79,auVar89);
    auVar95 = vfnmadd231ps_avx512vl(auVar95,auVar190,auVar76);
    auVar96 = vmulps_avx512vl(auVar81,auVar89);
    auVar96 = vfnmadd231ps_avx512vl(auVar96,auVar80,auVar76);
    auVar89 = vmulps_avx512vl(auVar78,auVar89);
    auVar89 = vfnmadd231ps_avx512vl(auVar89,auVar84,auVar76);
    auVar76 = vminps_avx512vl(auVar77,auVar90);
    auVar77 = vmaxps_avx512vl(auVar77,auVar90);
    auVar90 = vminps_avx512vl(auVar91,auVar92);
    auVar76 = vminps_avx512vl(auVar76,auVar90);
    auVar90 = vmaxps_avx512vl(auVar91,auVar92);
    auVar77 = vmaxps_avx512vl(auVar77,auVar90);
    auVar90 = vminps_avx512vl(auVar94,auVar95);
    auVar91 = vmaxps_avx512vl(auVar94,auVar95);
    auVar92 = vminps_avx512vl(auVar96,auVar89);
    auVar90 = vminps_avx512vl(auVar90,auVar92);
    auVar76 = vminps_avx512vl(auVar76,auVar90);
    auVar89 = vmaxps_avx512vl(auVar96,auVar89);
    auVar89 = vmaxps_avx512vl(auVar91,auVar89);
    auVar89 = vmaxps_avx512vl(auVar77,auVar89);
    uVar19 = vcmpps_avx512vl(auVar76,local_1c0,2);
    uVar21 = vcmpps_avx512vl(auVar89,local_1e0,5);
    uVar37 = 0;
    bVar33 = (byte)uVar19 & (byte)uVar21 & 0x7f;
    if (bVar33 != 0) {
      auVar89 = vsubps_avx512vl(auVar85,auVar139);
      auVar76 = vsubps_avx512vl(auVar86,auVar146);
      auVar77 = vsubps_avx512vl(auVar84,auVar93);
      auVar89 = vaddps_avx512vl(auVar89,auVar77);
      auVar77 = vsubps_avx512vl(auVar78,auVar83);
      auVar76 = vaddps_avx512vl(auVar76,auVar77);
      auVar77 = vmulps_avx512vl(auVar146,auVar89);
      auVar77 = vfnmadd231ps_avx512vl(auVar77,auVar76,auVar139);
      auVar87 = vmulps_avx512vl(auVar87,auVar89);
      auVar87 = vfnmadd213ps_avx512vl(auVar123,auVar76,auVar87);
      auVar88 = vmulps_avx512vl(auVar88,auVar89);
      auVar88 = vfnmadd213ps_avx512vl(auVar82,auVar76,auVar88);
      auVar82 = vmulps_avx512vl(auVar86,auVar89);
      auVar85 = vfnmadd231ps_avx512vl(auVar82,auVar76,auVar85);
      auVar82 = vmulps_avx512vl(auVar83,auVar89);
      auVar83 = vfnmadd231ps_avx512vl(auVar82,auVar76,auVar93);
      auVar82 = vmulps_avx512vl(auVar79,auVar89);
      auVar86 = vfnmadd213ps_avx512vl(auVar190,auVar76,auVar82);
      auVar82 = vmulps_avx512vl(auVar81,auVar89);
      auVar79 = vfnmadd213ps_avx512vl(auVar80,auVar76,auVar82);
      auVar82 = vmulps_avx512vl(auVar78,auVar89);
      auVar84 = vfnmadd231ps_avx512vl(auVar82,auVar84,auVar76);
      auVar80 = vminps_avx(auVar77,auVar87);
      auVar82 = vmaxps_avx(auVar77,auVar87);
      auVar81 = vminps_avx(auVar88,auVar85);
      auVar81 = vminps_avx(auVar80,auVar81);
      auVar80 = vmaxps_avx(auVar88,auVar85);
      auVar82 = vmaxps_avx(auVar82,auVar80);
      auVar93 = vminps_avx(auVar83,auVar86);
      auVar80 = vmaxps_avx(auVar83,auVar86);
      auVar83 = vminps_avx(auVar79,auVar84);
      auVar93 = vminps_avx(auVar93,auVar83);
      auVar93 = vminps_avx(auVar81,auVar93);
      auVar81 = vmaxps_avx(auVar79,auVar84);
      auVar80 = vmaxps_avx(auVar80,auVar81);
      auVar82 = vmaxps_avx(auVar82,auVar80);
      uVar19 = vcmpps_avx512vl(auVar82,local_1e0,5);
      uVar21 = vcmpps_avx512vl(auVar93,local_1c0,2);
      uVar37 = (uint)(bVar33 & (byte)uVar19 & (byte)uVar21);
    }
    if (uVar37 != 0) {
      auStack_420[uVar35] = uVar37;
      uVar19 = vmovlps_avx(auVar54);
      *(undefined8 *)(&uStack_280 + uVar35 * 2) = uVar19;
      uVar39 = vmovlps_avx512f(auVar74);
      auStack_1a0[uVar35] = uVar39;
      uVar35 = (ulong)((int)uVar35 + 1);
    }
    auVar54 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
    auVar240 = ZEXT1664(auVar54);
    auVar54 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
    auVar242 = ZEXT1664(auVar54);
    auVar54 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
    auVar243 = ZEXT1664(auVar54);
    auVar82 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
    auVar241 = ZEXT3264(auVar82);
    auVar244 = ZEXT464(0x3f800000);
    auVar54 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
    auVar245 = ZEXT1664(auVar54);
    do {
      auVar54 = auVar245._0_16_;
      if ((int)uVar35 == 0) {
        if (bVar43) {
          return local_5a1;
        }
        uVar111 = *(undefined4 *)(ray + k * 4 + 0x100);
        auVar23._4_4_ = uVar111;
        auVar23._0_4_ = uVar111;
        auVar23._8_4_ = uVar111;
        auVar23._12_4_ = uVar111;
        auVar23._16_4_ = uVar111;
        auVar23._20_4_ = uVar111;
        auVar23._24_4_ = uVar111;
        auVar23._28_4_ = uVar111;
        uVar19 = vcmpps_avx512vl(local_200,auVar23,2);
        uVar42 = (uint)uVar41 & (uint)uVar41 + 0xff & (uint)uVar19;
        uVar41 = (ulong)uVar42;
        local_5a1 = uVar42 != 0;
        if (!local_5a1) {
          return local_5a1;
        }
        goto LAB_01d9e347;
      }
      uVar34 = (int)uVar35 - 1;
      uVar36 = (ulong)uVar34;
      uVar37 = (&uStack_280)[uVar36 * 2];
      fVar206 = afStack_27c[uVar36 * 2];
      uVar7 = auStack_420[uVar36];
      auVar237._8_8_ = 0;
      auVar237._0_8_ = auStack_1a0[uVar36];
      auVar239 = ZEXT1664(auVar237);
      lVar40 = 0;
      for (uVar39 = (ulong)uVar7; (uVar39 & 1) == 0; uVar39 = uVar39 >> 1 | 0x8000000000000000) {
        lVar40 = lVar40 + 1;
      }
      uVar38 = uVar7 - 1 & uVar7;
      auStack_420[uVar36] = uVar38;
      if (uVar38 == 0) {
        uVar35 = (ulong)uVar34;
      }
      auVar48 = vcvtsi2ss_avx512f(auVar246._0_16_,lVar40);
      auVar58 = vmulss_avx512f(auVar48,SUB6416(ZEXT464(0x3e124925),0));
      lVar40 = lVar40 + 1;
      auVar48 = vcvtsi2ss_avx512f(auVar246._0_16_,lVar40);
      auVar48 = vmulss_avx512f(auVar48,SUB6416(ZEXT464(0x3e124925),0));
      auVar60 = auVar244._0_16_;
      auVar59 = vsubss_avx512f(auVar60,auVar58);
      auVar58 = vmulss_avx512f(ZEXT416((uint)fVar206),auVar58);
      auVar58 = vfmadd231ss_avx512f(auVar58,ZEXT416(uVar37),auVar59);
      auVar59 = vsubss_avx512f(auVar60,auVar48);
      auVar48 = vfmadd231ss_fma(ZEXT416((uint)(fVar206 * auVar48._0_4_)),ZEXT416(uVar37),auVar59);
      auVar59 = vsubss_avx512f(auVar48,auVar58);
      vucomiss_avx512f(auVar59);
      if (uVar7 == 0 || lVar40 == 0) break;
      auVar61 = vshufps_avx(auVar237,auVar237,0x50);
      vucomiss_avx512f(auVar59);
      auVar62 = vsubps_avx512vl(auVar54,auVar61);
      fVar206 = auVar61._0_4_;
      auVar134._0_4_ = fVar217 * fVar206;
      fVar191 = auVar61._4_4_;
      auVar134._4_4_ = fVar218 * fVar191;
      fVar204 = auVar61._8_4_;
      auVar134._8_4_ = fVar217 * fVar204;
      fVar205 = auVar61._12_4_;
      auVar134._12_4_ = fVar218 * fVar205;
      auVar143._0_4_ = fVar113 * fVar206;
      auVar143._4_4_ = fVar114 * fVar191;
      auVar143._8_4_ = fVar113 * fVar204;
      auVar143._12_4_ = fVar114 * fVar205;
      auVar150._0_4_ = fVar131 * fVar206;
      auVar150._4_4_ = fVar172 * fVar191;
      auVar150._8_4_ = fVar131 * fVar204;
      auVar150._12_4_ = fVar172 * fVar205;
      auVar117._0_4_ = fVar173 * fVar206;
      auVar117._4_4_ = fVar174 * fVar191;
      auVar117._8_4_ = fVar173 * fVar204;
      auVar117._12_4_ = fVar174 * fVar205;
      auVar61 = vfmadd231ps_fma(auVar134,auVar62,auVar56);
      auVar64 = vfmadd231ps_fma(auVar143,auVar62,auVar57);
      auVar63 = vfmadd231ps_avx512vl(auVar150,auVar62,auVar115);
      auVar62 = vfmadd231ps_fma(auVar117,auVar132,auVar62);
      auVar130._16_16_ = auVar61;
      auVar130._0_16_ = auVar61;
      auVar140._16_16_ = auVar64;
      auVar140._0_16_ = auVar64;
      auVar147._16_16_ = auVar63;
      auVar147._0_16_ = auVar63;
      auVar159._0_4_ = auVar58._0_4_;
      auVar159._4_4_ = auVar159._0_4_;
      auVar159._8_4_ = auVar159._0_4_;
      auVar159._12_4_ = auVar159._0_4_;
      uVar111 = auVar48._0_4_;
      auVar159._20_4_ = uVar111;
      auVar159._16_4_ = uVar111;
      auVar159._24_4_ = uVar111;
      auVar159._28_4_ = uVar111;
      auVar82 = vsubps_avx(auVar140,auVar130);
      auVar64 = vfmadd213ps_fma(auVar82,auVar159,auVar130);
      auVar82 = vsubps_avx(auVar147,auVar140);
      auVar74 = vfmadd213ps_fma(auVar82,auVar159,auVar140);
      auVar61 = vsubps_avx(auVar62,auVar63);
      auVar141._16_16_ = auVar61;
      auVar141._0_16_ = auVar61;
      auVar61 = vfmadd213ps_fma(auVar141,auVar159,auVar147);
      auVar82 = vsubps_avx(ZEXT1632(auVar74),ZEXT1632(auVar64));
      auVar64 = vfmadd213ps_fma(auVar82,auVar159,ZEXT1632(auVar64));
      auVar82 = vsubps_avx(ZEXT1632(auVar61),ZEXT1632(auVar74));
      auVar61 = vfmadd213ps_fma(auVar82,auVar159,ZEXT1632(auVar74));
      auVar82 = vsubps_avx(ZEXT1632(auVar61),ZEXT1632(auVar64));
      auVar69 = vfmadd231ps_fma(ZEXT1632(auVar64),auVar82,auVar159);
      auVar82 = vmulps_avx512vl(auVar82,auVar241._0_32_);
      auVar73 = auVar82._16_16_;
      fVar206 = auVar59._0_4_ * 0.33333334;
      auVar151._0_8_ =
           CONCAT44(auVar69._4_4_ + fVar206 * auVar82._4_4_,auVar69._0_4_ + fVar206 * auVar82._0_4_)
      ;
      auVar151._8_4_ = auVar69._8_4_ + fVar206 * auVar82._8_4_;
      auVar151._12_4_ = auVar69._12_4_ + fVar206 * auVar82._12_4_;
      auVar135._0_4_ = fVar206 * auVar82._16_4_;
      auVar135._4_4_ = fVar206 * auVar82._20_4_;
      auVar135._8_4_ = fVar206 * auVar82._24_4_;
      auVar135._12_4_ = fVar206 * auVar82._28_4_;
      auVar75 = vsubps_avx((undefined1  [16])0x0,auVar135);
      auVar72 = vshufpd_avx(auVar69,auVar69,3);
      auVar70 = vshufpd_avx((undefined1  [16])0x0,(undefined1  [16])0x0,3);
      auVar61 = vsubps_avx(auVar72,auVar69);
      auVar64 = vsubps_avx(auVar70,(undefined1  [16])0x0);
      auVar161._0_4_ = auVar64._0_4_ + auVar61._0_4_;
      auVar161._4_4_ = auVar64._4_4_ + auVar61._4_4_;
      auVar161._8_4_ = auVar64._8_4_ + auVar61._8_4_;
      auVar161._12_4_ = auVar64._12_4_ + auVar61._12_4_;
      auVar61 = vshufps_avx(auVar69,auVar69,0xb1);
      auVar64 = vshufps_avx(auVar151,auVar151,0xb1);
      auVar62 = vshufps_avx(auVar75,auVar75,0xb1);
      auVar74 = vshufps_avx((undefined1  [16])0x0,(undefined1  [16])0x0,0xb1);
      auVar221._4_4_ = auVar161._0_4_;
      auVar221._0_4_ = auVar161._0_4_;
      auVar221._8_4_ = auVar161._0_4_;
      auVar221._12_4_ = auVar161._0_4_;
      auVar63 = vshufps_avx(auVar161,auVar161,0x55);
      fVar206 = auVar63._0_4_;
      auVar177._0_4_ = auVar61._0_4_ * fVar206;
      fVar191 = auVar63._4_4_;
      auVar177._4_4_ = auVar61._4_4_ * fVar191;
      fVar204 = auVar63._8_4_;
      auVar177._8_4_ = auVar61._8_4_ * fVar204;
      fVar205 = auVar63._12_4_;
      auVar177._12_4_ = auVar61._12_4_ * fVar205;
      auVar185._0_4_ = auVar64._0_4_ * fVar206;
      auVar185._4_4_ = auVar64._4_4_ * fVar191;
      auVar185._8_4_ = auVar64._8_4_ * fVar204;
      auVar185._12_4_ = auVar64._12_4_ * fVar205;
      auVar196._0_4_ = auVar62._0_4_ * fVar206;
      auVar196._4_4_ = auVar62._4_4_ * fVar191;
      auVar196._8_4_ = auVar62._8_4_ * fVar204;
      auVar196._12_4_ = auVar62._12_4_ * fVar205;
      auVar162._0_4_ = auVar74._0_4_ * fVar206;
      auVar162._4_4_ = auVar74._4_4_ * fVar191;
      auVar162._8_4_ = auVar74._8_4_ * fVar204;
      auVar162._12_4_ = auVar74._12_4_ * fVar205;
      auVar61 = vfmadd231ps_fma(auVar177,auVar221,auVar69);
      auVar64 = vfmadd231ps_fma(auVar185,auVar221,auVar151);
      auVar63 = vfmadd231ps_fma(auVar196,auVar221,auVar75);
      auVar68 = vfmadd231ps_fma(auVar162,(undefined1  [16])0x0,auVar221);
      auVar71 = vshufpd_avx(auVar61,auVar61,1);
      auVar65 = vshufpd_avx(auVar64,auVar64,1);
      auVar66 = vshufpd_avx(auVar63,auVar63,1);
      auVar67 = vshufpd_avx(auVar68,auVar68,1);
      auVar62 = vminss_avx(auVar61,auVar64);
      auVar61 = vmaxss_avx(auVar64,auVar61);
      auVar74 = vminss_avx(auVar63,auVar68);
      auVar64 = vmaxss_avx(auVar68,auVar63);
      auVar74 = vminss_avx(auVar62,auVar74);
      auVar61 = vmaxss_avx(auVar64,auVar61);
      auVar63 = vminss_avx(auVar71,auVar65);
      auVar64 = vmaxss_avx(auVar65,auVar71);
      auVar71 = vminss_avx(auVar66,auVar67);
      auVar62 = vmaxss_avx(auVar67,auVar66);
      auVar63 = vminss_avx(auVar63,auVar71);
      auVar64 = vmaxss_avx(auVar62,auVar64);
      fVar204 = auVar74._0_4_;
      fVar191 = auVar64._0_4_;
      fVar206 = auVar61._0_4_;
      if ((0.0001 <= fVar204) || (fVar191 <= -0.0001)) {
        uVar19 = vcmpps_avx512vl(auVar63,SUB6416(ZEXT464(0x38d1b717),0),1);
        uVar21 = vcmpps_avx512vl(auVar74,SUB6416(ZEXT464(0x38d1b717),0),1);
        if ((-0.0001 < fVar206 & ((byte)uVar21 | (byte)uVar19)) != 0) goto LAB_01d9f240;
        uVar19 = vcmpps_avx512vl(SUB6416(ZEXT464(0xb8d1b717),0),auVar64,5);
        uVar21 = vcmpps_avx512vl(auVar63,SUB6416(ZEXT464(0x38d1b717),0),5);
        if ((((ushort)uVar21 | (ushort)uVar19) & 1) == 0) goto LAB_01d9f240;
        bVar20 = true;
        auVar239 = ZEXT1664(auVar237);
      }
      else {
LAB_01d9f240:
        auVar65 = auVar248._0_16_;
        uVar19 = vcmpss_avx512f(auVar74,auVar65,1);
        bVar20 = (bool)((byte)uVar19 & 1);
        iVar109 = auVar244._0_4_;
        fVar205 = (float)((uint)bVar20 * -0x40800000 + (uint)!bVar20 * iVar109);
        uVar19 = vcmpss_avx512f(auVar61,auVar65,1);
        bVar20 = (bool)((byte)uVar19 & 1);
        fVar207 = (float)((uint)bVar20 * -0x40800000 + (uint)!bVar20 * iVar109);
        bVar20 = fVar205 != fVar207;
        iVar247 = auVar248._0_4_;
        auVar98._16_16_ = auVar73;
        auVar98._0_16_ = SUB6416(ZEXT464(0x7f800000),0);
        auVar97._4_28_ = auVar98._4_28_;
        auVar97._0_4_ = (uint)bVar20 * iVar247 + (uint)!bVar20 * 0x7f800000;
        auVar71 = auVar97._0_16_;
        auVar100._16_16_ = auVar73;
        auVar100._0_16_ = SUB6416(ZEXT464(0xff800000),0);
        auVar99._4_28_ = auVar100._4_28_;
        auVar99._0_4_ = (uint)bVar20 * iVar247 + (uint)!bVar20 * -0x800000;
        auVar62 = auVar99._0_16_;
        uVar19 = vcmpss_avx512f(auVar63,auVar65,1);
        bVar20 = (bool)((byte)uVar19 & 1);
        fVar215 = (float)((uint)bVar20 * -0x40800000 + (uint)!bVar20 * iVar109);
        if ((fVar205 != fVar215) || (NAN(fVar205) || NAN(fVar215))) {
          fVar205 = auVar63._0_4_;
          bVar20 = fVar205 == fVar204;
          if ((!bVar20) || (NAN(fVar205) || NAN(fVar204))) {
            auVar74 = vxorps_avx512vl(auVar74,auVar243._0_16_);
            auVar232._0_4_ = auVar74._0_4_ / (fVar205 - fVar204);
            auVar232._4_12_ = auVar74._4_12_;
            auVar74 = vsubss_avx512f(auVar60,auVar232);
            auVar63 = vfmadd213ss_avx512f(auVar74,auVar65,auVar232);
            auVar74 = auVar63;
          }
          else {
            vucomiss_avx512f(auVar65);
            auVar102._16_16_ = auVar73;
            auVar102._0_16_ = SUB6416(ZEXT464(0x7f800000),0);
            auVar101._4_28_ = auVar102._4_28_;
            auVar101._0_4_ = (uint)bVar20 * iVar247 + (uint)!bVar20 * 0x7f800000;
            auVar63 = auVar101._0_16_;
            auVar74 = ZEXT416((uint)bVar20 * 0x3f800000 + (uint)!bVar20 * -0x800000);
          }
          auVar71 = vminss_avx(auVar71,auVar63);
          auVar62 = vmaxss_avx(auVar74,auVar62);
        }
        uVar19 = vcmpss_avx512f(auVar64,auVar65,1);
        bVar20 = (bool)((byte)uVar19 & 1);
        fVar204 = (float)((uint)bVar20 * -0x40800000 + (uint)!bVar20 * iVar109);
        if ((fVar207 != fVar204) || (NAN(fVar207) || NAN(fVar204))) {
          bVar20 = fVar191 == fVar206;
          if ((!bVar20) || (NAN(fVar191) || NAN(fVar206))) {
            auVar61 = vxorps_avx512vl(auVar61,auVar243._0_16_);
            auVar197._0_4_ = auVar61._0_4_ / (fVar191 - fVar206);
            auVar197._4_12_ = auVar61._4_12_;
            auVar61 = vsubss_avx512f(auVar60,auVar197);
            auVar64 = vfmadd213ss_avx512f(auVar61,auVar65,auVar197);
            auVar61 = auVar64;
          }
          else {
            vucomiss_avx512f(auVar65);
            auVar104._16_16_ = auVar73;
            auVar104._0_16_ = SUB6416(ZEXT464(0x7f800000),0);
            auVar103._4_28_ = auVar104._4_28_;
            auVar103._0_4_ = (uint)bVar20 * iVar247 + (uint)!bVar20 * 0x7f800000;
            auVar64 = auVar103._0_16_;
            auVar61 = ZEXT416((uint)bVar20 * 0x3f800000 + (uint)!bVar20 * -0x800000);
          }
          auVar71 = vminss_avx(auVar71,auVar64);
          auVar62 = vmaxss_avx(auVar61,auVar62);
        }
        bVar20 = fVar215 != fVar204;
        auVar61 = vminss_avx512f(auVar71,auVar60);
        auVar106._16_16_ = auVar73;
        auVar106._0_16_ = auVar71;
        auVar105._4_28_ = auVar106._4_28_;
        auVar105._0_4_ = (uint)bVar20 * auVar61._0_4_ + (uint)!bVar20 * auVar71._0_4_;
        auVar61 = vmaxss_avx512f(auVar60,auVar62);
        auVar108._16_16_ = auVar73;
        auVar108._0_16_ = auVar62;
        auVar107._4_28_ = auVar108._4_28_;
        auVar107._0_4_ = (uint)bVar20 * auVar61._0_4_ + (uint)!bVar20 * auVar62._0_4_;
        auVar61 = vmaxss_avx512f(auVar65,auVar105._0_16_);
        auVar64 = vminss_avx512f(auVar107._0_16_,auVar60);
        bVar20 = true;
        if (auVar61._0_4_ <= auVar64._0_4_) {
          auVar65 = vmaxss_avx512f(auVar65,ZEXT416((uint)(auVar61._0_4_ + -0.1)));
          auVar66 = vminss_avx512f(ZEXT416((uint)(auVar64._0_4_ + 0.1)),auVar60);
          auVar118._0_8_ = auVar69._0_8_;
          auVar118._8_8_ = auVar118._0_8_;
          auVar186._8_8_ = auVar151._0_8_;
          auVar186._0_8_ = auVar151._0_8_;
          auVar198._8_8_ = auVar75._0_8_;
          auVar198._0_8_ = auVar75._0_8_;
          auVar61 = vshufpd_avx(auVar151,auVar151,3);
          auVar64 = vshufpd_avx(auVar75,auVar75,3);
          auVar62 = vshufps_avx(auVar65,auVar66,0);
          auVar67 = vsubps_avx512vl(auVar54,auVar62);
          fVar206 = auVar62._0_4_;
          auVar230._0_4_ = fVar206 * auVar72._0_4_;
          fVar191 = auVar62._4_4_;
          auVar230._4_4_ = fVar191 * auVar72._4_4_;
          fVar204 = auVar62._8_4_;
          auVar230._8_4_ = fVar204 * auVar72._8_4_;
          fVar205 = auVar62._12_4_;
          auVar230._12_4_ = fVar205 * auVar72._12_4_;
          auVar152._0_4_ = fVar206 * auVar61._0_4_;
          auVar152._4_4_ = fVar191 * auVar61._4_4_;
          auVar152._8_4_ = fVar204 * auVar61._8_4_;
          auVar152._12_4_ = fVar205 * auVar61._12_4_;
          auVar155._0_4_ = fVar206 * auVar64._0_4_;
          auVar155._4_4_ = fVar191 * auVar64._4_4_;
          auVar155._8_4_ = fVar204 * auVar64._8_4_;
          auVar155._12_4_ = fVar205 * auVar64._12_4_;
          auVar136._0_4_ = fVar206 * auVar70._0_4_;
          auVar136._4_4_ = fVar191 * auVar70._4_4_;
          auVar136._8_4_ = fVar204 * auVar70._8_4_;
          auVar136._12_4_ = fVar205 * auVar70._12_4_;
          auVar74 = vfmadd231ps_fma(auVar230,auVar67,auVar118);
          auVar63 = vfmadd231ps_fma(auVar152,auVar67,auVar186);
          auVar71 = vfmadd231ps_fma(auVar155,auVar67,auVar198);
          auVar72 = vfmadd231ps_fma(auVar136,auVar67,ZEXT816(0));
          auVar61 = vsubss_avx512f(auVar60,auVar65);
          auVar64 = vmovshdup_avx512vl(auVar237);
          auVar68 = vfmadd231ss_avx512f(ZEXT416((uint)(auVar64._0_4_ * auVar65._0_4_)),auVar237,
                                        auVar61);
          auVar61 = vsubss_avx512f(auVar60,auVar66);
          auVar69 = vfmadd231ss_avx512f(ZEXT416((uint)(auVar66._0_4_ * auVar64._0_4_)),auVar237,
                                        auVar61);
          auVar70 = vdivss_avx512f(auVar60,auVar59);
          auVar59 = vsubps_avx(auVar63,auVar74);
          auVar160 = auVar240._0_16_;
          auVar64 = vmulps_avx512vl(auVar59,auVar160);
          auVar59 = vsubps_avx(auVar71,auVar63);
          auVar62 = vmulps_avx512vl(auVar59,auVar160);
          auVar59 = vsubps_avx(auVar72,auVar71);
          auVar59 = vmulps_avx512vl(auVar59,auVar160);
          auVar61 = vminps_avx(auVar62,auVar59);
          auVar59 = vmaxps_avx(auVar62,auVar59);
          auVar61 = vminps_avx(auVar64,auVar61);
          auVar59 = vmaxps_avx(auVar64,auVar59);
          auVar64 = vshufpd_avx(auVar61,auVar61,3);
          auVar62 = vshufpd_avx(auVar59,auVar59,3);
          auVar61 = vminps_avx(auVar61,auVar64);
          auVar59 = vmaxps_avx(auVar59,auVar62);
          fVar206 = auVar70._0_4_;
          auVar178._0_4_ = fVar206 * auVar61._0_4_;
          auVar178._4_4_ = fVar206 * auVar61._4_4_;
          auVar178._8_4_ = fVar206 * auVar61._8_4_;
          auVar178._12_4_ = fVar206 * auVar61._12_4_;
          auVar163._0_4_ = fVar206 * auVar59._0_4_;
          auVar163._4_4_ = fVar206 * auVar59._4_4_;
          auVar163._8_4_ = fVar206 * auVar59._8_4_;
          auVar163._12_4_ = fVar206 * auVar59._12_4_;
          auVar70 = vdivss_avx512f(auVar60,ZEXT416((uint)(auVar69._0_4_ - auVar68._0_4_)));
          auVar59 = vshufpd_avx(auVar74,auVar74,3);
          auVar61 = vshufpd_avx(auVar63,auVar63,3);
          auVar64 = vshufpd_avx(auVar71,auVar71,3);
          auVar62 = vshufpd_avx(auVar72,auVar72,3);
          auVar59 = vsubps_avx(auVar59,auVar74);
          auVar74 = vsubps_avx(auVar61,auVar63);
          auVar63 = vsubps_avx(auVar64,auVar71);
          auVar62 = vsubps_avx(auVar62,auVar72);
          auVar61 = vminps_avx(auVar59,auVar74);
          auVar59 = vmaxps_avx(auVar59,auVar74);
          auVar64 = vminps_avx(auVar63,auVar62);
          auVar64 = vminps_avx(auVar61,auVar64);
          auVar61 = vmaxps_avx(auVar63,auVar62);
          auVar59 = vmaxps_avx(auVar59,auVar61);
          fVar206 = auVar70._0_4_;
          auVar199._0_4_ = fVar206 * auVar64._0_4_;
          auVar199._4_4_ = fVar206 * auVar64._4_4_;
          auVar199._8_4_ = fVar206 * auVar64._8_4_;
          auVar199._12_4_ = fVar206 * auVar64._12_4_;
          auVar209._0_4_ = fVar206 * auVar59._0_4_;
          auVar209._4_4_ = fVar206 * auVar59._4_4_;
          auVar209._8_4_ = fVar206 * auVar59._8_4_;
          auVar209._12_4_ = fVar206 * auVar59._12_4_;
          auVar75 = vinsertps_avx512f(auVar58,auVar68,0x10);
          auVar74 = vinsertps_avx(auVar48,auVar69,0x10);
          auVar112._0_4_ = auVar75._0_4_ + auVar74._0_4_;
          auVar112._4_4_ = auVar75._4_4_ + auVar74._4_4_;
          auVar112._8_4_ = auVar75._8_4_ + auVar74._8_4_;
          auVar112._12_4_ = auVar75._12_4_ + auVar74._12_4_;
          auVar22._8_4_ = 0x3f000000;
          auVar22._0_8_ = 0x3f0000003f000000;
          auVar22._12_4_ = 0x3f000000;
          auVar66 = vmulps_avx512vl(auVar112,auVar22);
          auVar64 = vshufps_avx(auVar66,auVar66,0x54);
          uVar111 = auVar66._0_4_;
          auVar124._4_4_ = uVar111;
          auVar124._0_4_ = uVar111;
          auVar124._8_4_ = uVar111;
          auVar124._12_4_ = uVar111;
          auVar61 = vfmadd213ps_fma(auVar45,auVar124,auVar4);
          auVar63 = vfmadd213ps_avx512vl(auVar47,auVar124,auVar55);
          auVar62 = vfmadd213ps_fma(auVar46,auVar124,auVar51);
          auVar59 = vsubps_avx(auVar63,auVar61);
          auVar61 = vfmadd213ps_fma(auVar59,auVar124,auVar61);
          auVar59 = vsubps_avx(auVar62,auVar63);
          auVar59 = vfmadd213ps_fma(auVar59,auVar124,auVar63);
          auVar59 = vsubps_avx(auVar59,auVar61);
          auVar61 = vfmadd231ps_fma(auVar61,auVar59,auVar124);
          auVar71 = vmulps_avx512vl(auVar59,auVar160);
          auVar222._8_8_ = auVar61._0_8_;
          auVar222._0_8_ = auVar61._0_8_;
          auVar59 = vshufpd_avx(auVar61,auVar61,3);
          auVar61 = vshufps_avx(auVar66,auVar66,0x55);
          auVar62 = vsubps_avx(auVar59,auVar222);
          auVar63 = vfmadd231ps_fma(auVar222,auVar61,auVar62);
          auVar233._8_8_ = auVar71._0_8_;
          auVar233._0_8_ = auVar71._0_8_;
          auVar59 = vshufpd_avx(auVar71,auVar71,3);
          auVar59 = vsubps_avx(auVar59,auVar233);
          auVar61 = vfmadd213ps_fma(auVar59,auVar61,auVar233);
          auVar125._0_8_ = auVar62._0_8_ ^ 0x8000000080000000;
          auVar125._8_4_ = auVar62._8_4_ ^ 0x80000000;
          auVar125._12_4_ = auVar62._12_4_ ^ 0x80000000;
          auVar59 = vmovshdup_avx(auVar61);
          auVar234._0_8_ = auVar59._0_8_ ^ 0x8000000080000000;
          auVar234._8_4_ = auVar59._8_4_ ^ 0x80000000;
          auVar234._12_4_ = auVar59._12_4_ ^ 0x80000000;
          auVar71 = vmovshdup_avx512vl(auVar62);
          auVar72 = vpermt2ps_avx512vl(auVar234,ZEXT416(5),auVar62);
          auVar59 = vfmsub231ss_avx512f(ZEXT416((uint)(auVar59._0_4_ * auVar62._0_4_)),auVar61,
                                        auVar71);
          auVar61 = vpermt2ps_avx512vl(auVar61,SUB6416(ZEXT464(4),0),auVar125);
          auVar137._0_4_ = auVar59._0_4_;
          auVar137._4_4_ = auVar137._0_4_;
          auVar137._8_4_ = auVar137._0_4_;
          auVar137._12_4_ = auVar137._0_4_;
          auVar59 = vdivps_avx(auVar72,auVar137);
          auVar61 = vdivps_avx(auVar61,auVar137);
          fVar191 = auVar63._0_4_;
          auVar62 = vshufps_avx(auVar63,auVar63,0x55);
          fVar206 = auVar61._0_4_;
          auVar223._0_4_ = fVar191 * auVar59._0_4_ + auVar62._0_4_ * fVar206;
          auVar223._4_4_ = fVar191 * auVar59._4_4_ + auVar62._4_4_ * auVar61._4_4_;
          auVar223._8_4_ = fVar191 * auVar59._8_4_ + auVar62._8_4_ * auVar61._8_4_;
          auVar223._12_4_ = fVar191 * auVar59._12_4_ + auVar62._12_4_ * auVar61._12_4_;
          auVar67 = vsubps_avx(auVar64,auVar223);
          auVar63 = vmovshdup_avx(auVar59);
          auVar64 = vinsertps_avx(auVar178,auVar199,0x1c);
          auVar235._0_4_ = auVar63._0_4_ * auVar64._0_4_;
          auVar235._4_4_ = auVar63._4_4_ * auVar64._4_4_;
          auVar235._8_4_ = auVar63._8_4_ * auVar64._8_4_;
          auVar235._12_4_ = auVar63._12_4_ * auVar64._12_4_;
          auVar62 = vinsertps_avx(auVar163,auVar209,0x1c);
          auVar224._0_4_ = auVar63._0_4_ * auVar62._0_4_;
          auVar224._4_4_ = auVar63._4_4_ * auVar62._4_4_;
          auVar224._8_4_ = auVar63._8_4_ * auVar62._8_4_;
          auVar224._12_4_ = auVar63._12_4_ * auVar62._12_4_;
          auVar65 = vminps_avx512vl(auVar235,auVar224);
          auVar72 = vmaxps_avx(auVar224,auVar235);
          auVar70 = vmovshdup_avx(auVar61);
          auVar63 = vinsertps_avx(auVar199,auVar178,0x4c);
          auVar200._0_4_ = auVar70._0_4_ * auVar63._0_4_;
          auVar200._4_4_ = auVar70._4_4_ * auVar63._4_4_;
          auVar200._8_4_ = auVar70._8_4_ * auVar63._8_4_;
          auVar200._12_4_ = auVar70._12_4_ * auVar63._12_4_;
          auVar71 = vinsertps_avx(auVar209,auVar163,0x4c);
          auVar210._0_4_ = auVar70._0_4_ * auVar71._0_4_;
          auVar210._4_4_ = auVar70._4_4_ * auVar71._4_4_;
          auVar210._8_4_ = auVar70._8_4_ * auVar71._8_4_;
          auVar210._12_4_ = auVar70._12_4_ * auVar71._12_4_;
          auVar70 = vminps_avx(auVar200,auVar210);
          auVar65 = vaddps_avx512vl(auVar65,auVar70);
          auVar70 = vmaxps_avx(auVar210,auVar200);
          auVar201._0_4_ = auVar72._0_4_ + auVar70._0_4_;
          auVar201._4_4_ = auVar72._4_4_ + auVar70._4_4_;
          auVar201._8_4_ = auVar72._8_4_ + auVar70._8_4_;
          auVar201._12_4_ = auVar72._12_4_ + auVar70._12_4_;
          auVar211._8_8_ = 0x3f80000000000000;
          auVar211._0_8_ = 0x3f80000000000000;
          auVar72 = vsubps_avx(auVar211,auVar201);
          auVar70 = vsubps_avx(auVar211,auVar65);
          auVar65 = vsubps_avx(auVar75,auVar66);
          auVar66 = vsubps_avx(auVar74,auVar66);
          fVar215 = auVar65._0_4_;
          auVar236._0_4_ = fVar215 * auVar72._0_4_;
          fVar216 = auVar65._4_4_;
          auVar236._4_4_ = fVar216 * auVar72._4_4_;
          fVar226 = auVar65._8_4_;
          auVar236._8_4_ = fVar226 * auVar72._8_4_;
          fVar227 = auVar65._12_4_;
          auVar236._12_4_ = fVar227 * auVar72._12_4_;
          auVar73 = vbroadcastss_avx512vl(auVar59);
          auVar64 = vmulps_avx512vl(auVar73,auVar64);
          auVar62 = vmulps_avx512vl(auVar73,auVar62);
          auVar73 = vminps_avx512vl(auVar64,auVar62);
          auVar64 = vmaxps_avx(auVar62,auVar64);
          auVar179._0_4_ = fVar206 * auVar63._0_4_;
          auVar179._4_4_ = fVar206 * auVar63._4_4_;
          auVar179._8_4_ = fVar206 * auVar63._8_4_;
          auVar179._12_4_ = fVar206 * auVar63._12_4_;
          auVar164._0_4_ = fVar206 * auVar71._0_4_;
          auVar164._4_4_ = fVar206 * auVar71._4_4_;
          auVar164._8_4_ = fVar206 * auVar71._8_4_;
          auVar164._12_4_ = fVar206 * auVar71._12_4_;
          auVar62 = vminps_avx(auVar179,auVar164);
          auVar63 = vaddps_avx512vl(auVar73,auVar62);
          auVar71 = vmulps_avx512vl(auVar65,auVar70);
          fVar191 = auVar66._0_4_;
          auVar202._0_4_ = fVar191 * auVar72._0_4_;
          fVar204 = auVar66._4_4_;
          auVar202._4_4_ = fVar204 * auVar72._4_4_;
          fVar205 = auVar66._8_4_;
          auVar202._8_4_ = fVar205 * auVar72._8_4_;
          fVar207 = auVar66._12_4_;
          auVar202._12_4_ = fVar207 * auVar72._12_4_;
          auVar212._0_4_ = fVar191 * auVar70._0_4_;
          auVar212._4_4_ = fVar204 * auVar70._4_4_;
          auVar212._8_4_ = fVar205 * auVar70._8_4_;
          auVar212._12_4_ = fVar207 * auVar70._12_4_;
          auVar62 = vmaxps_avx(auVar164,auVar179);
          auVar165._0_4_ = auVar64._0_4_ + auVar62._0_4_;
          auVar165._4_4_ = auVar64._4_4_ + auVar62._4_4_;
          auVar165._8_4_ = auVar64._8_4_ + auVar62._8_4_;
          auVar165._12_4_ = auVar64._12_4_ + auVar62._12_4_;
          auVar180._8_8_ = 0x3f800000;
          auVar180._0_8_ = 0x3f800000;
          auVar64 = vsubps_avx(auVar180,auVar165);
          auVar62 = vsubps_avx(auVar180,auVar63);
          auVar231._0_4_ = fVar215 * auVar64._0_4_;
          auVar231._4_4_ = fVar216 * auVar64._4_4_;
          auVar231._8_4_ = fVar226 * auVar64._8_4_;
          auVar231._12_4_ = fVar227 * auVar64._12_4_;
          auVar225._0_4_ = fVar215 * auVar62._0_4_;
          auVar225._4_4_ = fVar216 * auVar62._4_4_;
          auVar225._8_4_ = fVar226 * auVar62._8_4_;
          auVar225._12_4_ = fVar227 * auVar62._12_4_;
          auVar166._0_4_ = fVar191 * auVar64._0_4_;
          auVar166._4_4_ = fVar204 * auVar64._4_4_;
          auVar166._8_4_ = fVar205 * auVar64._8_4_;
          auVar166._12_4_ = fVar207 * auVar64._12_4_;
          auVar181._0_4_ = fVar191 * auVar62._0_4_;
          auVar181._4_4_ = fVar204 * auVar62._4_4_;
          auVar181._8_4_ = fVar205 * auVar62._8_4_;
          auVar181._12_4_ = fVar207 * auVar62._12_4_;
          auVar64 = vminps_avx(auVar231,auVar225);
          auVar62 = vminps_avx(auVar166,auVar181);
          auVar63 = vminps_avx(auVar64,auVar62);
          auVar64 = vmaxps_avx(auVar225,auVar231);
          auVar62 = vmaxps_avx(auVar181,auVar166);
          auVar62 = vmaxps_avx(auVar62,auVar64);
          auVar72 = vminps_avx512vl(auVar236,auVar71);
          auVar64 = vminps_avx(auVar202,auVar212);
          auVar64 = vminps_avx(auVar72,auVar64);
          auVar64 = vhaddps_avx(auVar63,auVar64);
          auVar71 = vmaxps_avx512vl(auVar71,auVar236);
          auVar63 = vmaxps_avx(auVar212,auVar202);
          auVar63 = vmaxps_avx(auVar63,auVar71);
          auVar62 = vhaddps_avx(auVar62,auVar63);
          auVar64 = vshufps_avx(auVar64,auVar64,0xe8);
          auVar62 = vshufps_avx(auVar62,auVar62,0xe8);
          auVar167._0_4_ = auVar64._0_4_ + auVar67._0_4_;
          auVar167._4_4_ = auVar64._4_4_ + auVar67._4_4_;
          auVar167._8_4_ = auVar64._8_4_ + auVar67._8_4_;
          auVar167._12_4_ = auVar64._12_4_ + auVar67._12_4_;
          auVar182._0_4_ = auVar62._0_4_ + auVar67._0_4_;
          auVar182._4_4_ = auVar62._4_4_ + auVar67._4_4_;
          auVar182._8_4_ = auVar62._8_4_ + auVar67._8_4_;
          auVar182._12_4_ = auVar62._12_4_ + auVar67._12_4_;
          auVar64 = vmaxps_avx(auVar75,auVar167);
          auVar62 = vminps_avx(auVar182,auVar74);
          uVar39 = vcmpps_avx512vl(auVar62,auVar64,1);
          auVar64 = vinsertps_avx(auVar68,auVar69,0x10);
          auVar239 = ZEXT1664(auVar64);
          auVar62 = ZEXT416(5);
          if ((uVar39 & 3) == 0) {
            vucomiss_avx512f(auVar58);
            auVar62 = vxorps_avx512vl(auVar62,auVar62);
            auVar248 = ZEXT1664(auVar62);
            local_450 = auVar5._0_4_;
            fStack_44c = auVar5._4_4_;
            fStack_448 = auVar5._8_4_;
            fStack_444 = auVar5._12_4_;
            if ((uint)uVar35 < 4 && (uVar7 == 0 || lVar40 == 0)) {
              bVar20 = false;
            }
            else {
              lVar40 = 200;
              do {
                auVar74 = vsubss_avx512f(auVar60,auVar67);
                fVar205 = auVar74._0_4_;
                fVar191 = fVar205 * fVar205 * fVar205;
                fVar207 = auVar67._0_4_;
                fVar204 = fVar207 * 3.0 * fVar205 * fVar205;
                fVar205 = fVar205 * fVar207 * fVar207 * 3.0;
                auVar153._4_4_ = fVar191;
                auVar153._0_4_ = fVar191;
                auVar153._8_4_ = fVar191;
                auVar153._12_4_ = fVar191;
                auVar144._4_4_ = fVar204;
                auVar144._0_4_ = fVar204;
                auVar144._8_4_ = fVar204;
                auVar144._12_4_ = fVar204;
                auVar119._4_4_ = fVar205;
                auVar119._0_4_ = fVar205;
                auVar119._8_4_ = fVar205;
                auVar119._12_4_ = fVar205;
                fVar207 = fVar207 * fVar207 * fVar207;
                auVar156._0_4_ = local_450 * fVar207;
                auVar156._4_4_ = fStack_44c * fVar207;
                auVar156._8_4_ = fStack_448 * fVar207;
                auVar156._12_4_ = fStack_444 * fVar207;
                auVar74 = vfmadd231ps_fma(auVar156,auVar51,auVar119);
                auVar74 = vfmadd231ps_fma(auVar74,auVar55,auVar144);
                auVar74 = vfmadd231ps_fma(auVar74,auVar4,auVar153);
                auVar120._8_8_ = auVar74._0_8_;
                auVar120._0_8_ = auVar74._0_8_;
                auVar74 = vshufpd_avx(auVar74,auVar74,3);
                auVar63 = vshufps_avx(auVar67,auVar67,0x55);
                auVar74 = vsubps_avx(auVar74,auVar120);
                auVar63 = vfmadd213ps_fma(auVar74,auVar63,auVar120);
                fVar191 = auVar63._0_4_;
                auVar74 = vshufps_avx(auVar63,auVar63,0x55);
                auVar121._0_4_ = auVar59._0_4_ * fVar191 + fVar206 * auVar74._0_4_;
                auVar121._4_4_ = auVar59._4_4_ * fVar191 + auVar61._4_4_ * auVar74._4_4_;
                auVar121._8_4_ = auVar59._8_4_ * fVar191 + auVar61._8_4_ * auVar74._8_4_;
                auVar121._12_4_ = auVar59._12_4_ * fVar191 + auVar61._12_4_ * auVar74._12_4_;
                auVar67 = vsubps_avx(auVar67,auVar121);
                auVar74 = vandps_avx512vl(auVar63,auVar242._0_16_);
                auVar63 = vprolq_avx512vl(auVar74,0x20);
                auVar74 = vmaxss_avx(auVar63,auVar74);
                bVar44 = auVar74._0_4_ <= fVar110;
                if (auVar74._0_4_ < fVar110) {
                  auVar59 = vucomiss_avx512f(auVar62);
                  if (bVar44) {
                    auVar60 = vucomiss_avx512f(auVar59);
                    auVar244 = ZEXT1664(auVar60);
                    if (bVar44) {
                      vmovshdup_avx(auVar59);
                      auVar60 = vucomiss_avx512f(auVar62);
                      if (bVar44) {
                        auVar61 = vucomiss_avx512f(auVar60);
                        auVar244 = ZEXT1664(auVar61);
                        if (bVar44) {
                          auVar74 = vinsertps_avx(ZEXT416((uint)pre->ray_space[k].vx.field_0.m128[2]
                                                         ),ZEXT416((uint)pre->ray_space[k].vy.
                                                                         field_0.m128[2]),0x1c);
                          auVar67 = vinsertps_avx(auVar74,ZEXT416((uint)pre->ray_space[k].vz.field_0
                                                                        .m128[2]),0x28);
                          auVar74 = vdpps_avx(auVar67,local_290,0x7f);
                          auVar63 = vdpps_avx(auVar67,local_2a0,0x7f);
                          auVar71 = vdpps_avx(auVar67,local_2b0,0x7f);
                          auVar72 = vdpps_avx(auVar67,local_2c0,0x7f);
                          auVar70 = vdpps_avx(auVar67,local_2d0,0x7f);
                          auVar65 = vdpps_avx(auVar67,local_2e0,0x7f);
                          auVar66 = vdpps_avx(auVar67,local_2f0,0x7f);
                          auVar67 = vdpps_avx(auVar67,local_300,0x7f);
                          auVar75 = vsubss_avx512f(auVar61,auVar60);
                          fVar206 = auVar60._0_4_;
                          auVar60 = vfmadd231ss_fma(ZEXT416((uint)(fVar206 * auVar70._0_4_)),auVar75
                                                    ,auVar74);
                          auVar74 = vfmadd231ss_fma(ZEXT416((uint)(auVar65._0_4_ * fVar206)),auVar75
                                                    ,auVar63);
                          auVar63 = vfmadd231ss_fma(ZEXT416((uint)(auVar66._0_4_ * fVar206)),auVar75
                                                    ,auVar71);
                          auVar71 = vfmadd231ss_fma(ZEXT416((uint)(fVar206 * auVar67._0_4_)),auVar75
                                                    ,auVar72);
                          auVar61 = vsubss_avx512f(auVar61,auVar59);
                          auVar157._0_4_ = auVar61._0_4_;
                          fVar206 = auVar157._0_4_ * auVar157._0_4_ * auVar157._0_4_;
                          local_120 = auVar59._0_4_;
                          fVar191 = local_120 * 3.0 * auVar157._0_4_ * auVar157._0_4_;
                          fVar204 = auVar157._0_4_ * local_120 * local_120 * 3.0;
                          fVar207 = local_120 * local_120 * local_120;
                          auVar61 = vfmadd231ss_fma(ZEXT416((uint)(fVar207 * auVar71._0_4_)),
                                                    ZEXT416((uint)fVar204),auVar63);
                          auVar61 = vfmadd231ss_fma(auVar61,ZEXT416((uint)fVar191),auVar74);
                          auVar60 = vfmadd231ss_fma(auVar61,ZEXT416((uint)fVar206),auVar60);
                          fVar205 = auVar60._0_4_;
                          if ((fVar1 <= fVar205) &&
                             (fVar215 = *(float *)(ray + k * 4 + 0x100), fVar205 <= fVar215)) {
                            auVar60 = vshufps_avx(auVar59,auVar59,0x55);
                            auVar74 = vsubps_avx512vl(auVar54,auVar60);
                            fVar216 = auVar60._0_4_;
                            auVar187._0_4_ = fVar216 * (float)local_320._0_4_;
                            fVar226 = auVar60._4_4_;
                            auVar187._4_4_ = fVar226 * (float)local_320._4_4_;
                            fVar227 = auVar60._8_4_;
                            auVar187._8_4_ = fVar227 * fStack_318;
                            fVar228 = auVar60._12_4_;
                            auVar187._12_4_ = fVar228 * fStack_314;
                            auVar203._0_4_ = fVar216 * (float)local_370._0_4_;
                            auVar203._4_4_ = fVar226 * (float)local_370._4_4_;
                            auVar203._8_4_ = fVar227 * fStack_368;
                            auVar203._12_4_ = fVar228 * fStack_364;
                            auVar213._0_4_ = fVar216 * (float)local_380._0_4_;
                            auVar213._4_4_ = fVar226 * (float)local_380._4_4_;
                            auVar213._8_4_ = fVar227 * fStack_378;
                            auVar213._12_4_ = fVar228 * fStack_374;
                            auVar168._0_4_ = fVar216 * (float)local_340._0_4_;
                            auVar168._4_4_ = fVar226 * (float)local_340._4_4_;
                            auVar168._8_4_ = fVar227 * fStack_338;
                            auVar168._12_4_ = fVar228 * fStack_334;
                            auVar54 = vfmadd231ps_fma(auVar187,auVar74,local_310);
                            auVar60 = vfmadd231ps_fma(auVar203,auVar74,local_350);
                            auVar61 = vfmadd231ps_fma(auVar213,auVar74,local_360);
                            auVar74 = vfmadd231ps_fma(auVar168,auVar74,local_330);
                            auVar54 = vsubps_avx(auVar60,auVar54);
                            auVar60 = vsubps_avx(auVar61,auVar60);
                            auVar61 = vsubps_avx(auVar74,auVar61);
                            auVar214._0_4_ = local_120 * auVar60._0_4_;
                            auVar214._4_4_ = local_120 * auVar60._4_4_;
                            auVar214._8_4_ = local_120 * auVar60._8_4_;
                            auVar214._12_4_ = local_120 * auVar60._12_4_;
                            auVar157._4_4_ = auVar157._0_4_;
                            auVar157._8_4_ = auVar157._0_4_;
                            auVar157._12_4_ = auVar157._0_4_;
                            auVar54 = vfmadd231ps_fma(auVar214,auVar157,auVar54);
                            auVar169._0_4_ = local_120 * auVar61._0_4_;
                            auVar169._4_4_ = local_120 * auVar61._4_4_;
                            auVar169._8_4_ = local_120 * auVar61._8_4_;
                            auVar169._12_4_ = local_120 * auVar61._12_4_;
                            auVar60 = vfmadd231ps_fma(auVar169,auVar157,auVar60);
                            auVar170._0_4_ = local_120 * auVar60._0_4_;
                            auVar170._4_4_ = local_120 * auVar60._4_4_;
                            auVar170._8_4_ = local_120 * auVar60._8_4_;
                            auVar170._12_4_ = local_120 * auVar60._12_4_;
                            auVar54 = vfmadd231ps_fma(auVar170,auVar157,auVar54);
                            auVar54 = vmulps_avx512vl(auVar54,auVar160);
                            pGVar8 = (context->scene->geometries).items[uVar42].ptr;
                            if ((pGVar8->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) {
                              bVar44 = false;
                            }
                            else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                                    (bVar44 = true,
                                    pGVar8->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                              auVar154._0_4_ = fVar207 * (float)local_3c0._0_4_;
                              auVar154._4_4_ = fVar207 * (float)local_3c0._4_4_;
                              auVar154._8_4_ = fVar207 * fStack_3b8;
                              auVar154._12_4_ = fVar207 * fStack_3b4;
                              auVar145._4_4_ = fVar204;
                              auVar145._0_4_ = fVar204;
                              auVar145._8_4_ = fVar204;
                              auVar145._12_4_ = fVar204;
                              auVar60 = vfmadd132ps_fma(auVar145,auVar154,local_3b0);
                              auVar138._4_4_ = fVar191;
                              auVar138._0_4_ = fVar191;
                              auVar138._8_4_ = fVar191;
                              auVar138._12_4_ = fVar191;
                              auVar60 = vfmadd132ps_fma(auVar138,auVar60,local_3a0);
                              auVar126._4_4_ = fVar206;
                              auVar126._0_4_ = fVar206;
                              auVar126._8_4_ = fVar206;
                              auVar126._12_4_ = fVar206;
                              auVar74 = vfmadd132ps_fma(auVar126,auVar60,local_390);
                              auVar60 = vshufps_avx(auVar74,auVar74,0xc9);
                              auVar61 = vshufps_avx(auVar54,auVar54,0xc9);
                              auVar127._0_4_ = auVar74._0_4_ * auVar61._0_4_;
                              auVar127._4_4_ = auVar74._4_4_ * auVar61._4_4_;
                              auVar127._8_4_ = auVar74._8_4_ * auVar61._8_4_;
                              auVar127._12_4_ = auVar74._12_4_ * auVar61._12_4_;
                              auVar54 = vfmsub231ps_fma(auVar127,auVar54,auVar60);
                              auVar148._8_4_ = 1;
                              auVar148._0_8_ = 0x100000001;
                              auVar148._12_4_ = 1;
                              auVar148._16_4_ = 1;
                              auVar148._20_4_ = 1;
                              auVar148._24_4_ = 1;
                              auVar148._28_4_ = 1;
                              local_100 = vpermps_avx2(auVar148,ZEXT1632(auVar59));
                              auVar82 = vpermps_avx2(auVar148,ZEXT1632(auVar54));
                              local_160 = vpermps_avx512vl(auVar246._0_32_,ZEXT1632(auVar54));
                              local_140 = auVar54._0_4_;
                              local_180[0] = (RTCHitN)auVar82[0];
                              local_180[1] = (RTCHitN)auVar82[1];
                              local_180[2] = (RTCHitN)auVar82[2];
                              local_180[3] = (RTCHitN)auVar82[3];
                              local_180[4] = (RTCHitN)auVar82[4];
                              local_180[5] = (RTCHitN)auVar82[5];
                              local_180[6] = (RTCHitN)auVar82[6];
                              local_180[7] = (RTCHitN)auVar82[7];
                              local_180[8] = (RTCHitN)auVar82[8];
                              local_180[9] = (RTCHitN)auVar82[9];
                              local_180[10] = (RTCHitN)auVar82[10];
                              local_180[0xb] = (RTCHitN)auVar82[0xb];
                              local_180[0xc] = (RTCHitN)auVar82[0xc];
                              local_180[0xd] = (RTCHitN)auVar82[0xd];
                              local_180[0xe] = (RTCHitN)auVar82[0xe];
                              local_180[0xf] = (RTCHitN)auVar82[0xf];
                              local_180[0x10] = (RTCHitN)auVar82[0x10];
                              local_180[0x11] = (RTCHitN)auVar82[0x11];
                              local_180[0x12] = (RTCHitN)auVar82[0x12];
                              local_180[0x13] = (RTCHitN)auVar82[0x13];
                              local_180[0x14] = (RTCHitN)auVar82[0x14];
                              local_180[0x15] = (RTCHitN)auVar82[0x15];
                              local_180[0x16] = (RTCHitN)auVar82[0x16];
                              local_180[0x17] = (RTCHitN)auVar82[0x17];
                              local_180[0x18] = (RTCHitN)auVar82[0x18];
                              local_180[0x19] = (RTCHitN)auVar82[0x19];
                              local_180[0x1a] = (RTCHitN)auVar82[0x1a];
                              local_180[0x1b] = (RTCHitN)auVar82[0x1b];
                              local_180[0x1c] = (RTCHitN)auVar82[0x1c];
                              local_180[0x1d] = (RTCHitN)auVar82[0x1d];
                              local_180[0x1e] = (RTCHitN)auVar82[0x1e];
                              local_180[0x1f] = (RTCHitN)auVar82[0x1f];
                              uStack_13c = local_140;
                              uStack_138 = local_140;
                              uStack_134 = local_140;
                              uStack_130 = local_140;
                              uStack_12c = local_140;
                              uStack_128 = local_140;
                              uStack_124 = local_140;
                              fStack_11c = local_120;
                              fStack_118 = local_120;
                              fStack_114 = local_120;
                              fStack_110 = local_120;
                              fStack_10c = local_120;
                              fStack_108 = local_120;
                              fStack_104 = local_120;
                              local_e0 = local_220._0_8_;
                              uStack_d8 = local_220._8_8_;
                              uStack_d0 = local_220._16_8_;
                              uStack_c8 = local_220._24_8_;
                              local_c0 = local_240;
                              vpcmpeqd_avx2(local_240,local_240);
                              uStack_9c = context->user->instID[0];
                              local_a0 = uStack_9c;
                              uStack_98 = uStack_9c;
                              uStack_94 = uStack_9c;
                              uStack_90 = uStack_9c;
                              uStack_8c = uStack_9c;
                              uStack_88 = uStack_9c;
                              uStack_84 = uStack_9c;
                              uStack_7c = context->user->instPrimID[0];
                              local_80 = uStack_7c;
                              uStack_78 = uStack_7c;
                              uStack_74 = uStack_7c;
                              uStack_70 = uStack_7c;
                              uStack_6c = uStack_7c;
                              uStack_68 = uStack_7c;
                              uStack_64 = uStack_7c;
                              *(float *)(ray + k * 4 + 0x100) = fVar205;
                              local_3e0 = local_260._0_8_;
                              uStack_3d8 = local_260._8_8_;
                              uStack_3d0 = local_260._16_8_;
                              uStack_3c8 = local_260._24_8_;
                              local_410.valid = (int *)&local_3e0;
                              local_410.geometryUserPtr = pGVar8->userPtr;
                              local_410.context = context->user;
                              local_410.ray = (RTCRayN *)ray;
                              local_410.hit = local_180;
                              local_410.N = 8;
                              if (pGVar8->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                                (*pGVar8->occlusionFilterN)(&local_410);
                                auVar54 = vxorps_avx512vl(auVar62,auVar62);
                                auVar248 = ZEXT1664(auVar54);
                                auVar54 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                                auVar245 = ZEXT1664(auVar54);
                                auVar244 = ZEXT464(0x3f800000);
                                auVar82 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                                auVar241 = ZEXT3264(auVar82);
                                auVar54 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                                auVar243 = ZEXT1664(auVar54);
                                auVar54 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                                auVar242 = ZEXT1664(auVar54);
                                auVar54 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                                auVar240 = ZEXT1664(auVar54);
                                auVar82 = vbroadcastss_avx512vl(ZEXT416(2));
                                auVar246 = ZEXT3264(auVar82);
                              }
                              auVar54 = auVar248._0_16_;
                              auVar31._8_8_ = uStack_3d8;
                              auVar31._0_8_ = local_3e0;
                              auVar31._16_8_ = uStack_3d0;
                              auVar31._24_8_ = uStack_3c8;
                              if (auVar31 == (undefined1  [32])0x0) {
                                bVar44 = false;
                              }
                              else {
                                p_Var11 = context->args->filter;
                                if ((p_Var11 != (RTCFilterFunctionN)0x0) &&
                                   (((context->args->flags &
                                     RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                                     RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                    (((pGVar8->field_8).field_0x2 & 0x40) != 0)))) {
                                  (*p_Var11)(&local_410);
                                  auVar54 = vxorps_avx512vl(auVar54,auVar54);
                                  auVar248 = ZEXT1664(auVar54);
                                  auVar54 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                                  auVar245 = ZEXT1664(auVar54);
                                  auVar244 = ZEXT464(0x3f800000);
                                  auVar82 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                                  auVar241 = ZEXT3264(auVar82);
                                  auVar54 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                                  auVar243 = ZEXT1664(auVar54);
                                  auVar54 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                                  auVar242 = ZEXT1664(auVar54);
                                  auVar54 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                                  auVar240 = ZEXT1664(auVar54);
                                  auVar82 = vbroadcastss_avx512vl(ZEXT416(2));
                                  auVar246 = ZEXT3264(auVar82);
                                }
                                auVar32._8_8_ = uStack_3d8;
                                auVar32._0_8_ = local_3e0;
                                auVar32._16_8_ = uStack_3d0;
                                auVar32._24_8_ = uStack_3c8;
                                uVar39 = vptestmd_avx512vl(auVar32,auVar32);
                                auVar82 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                                bVar44 = (bool)((byte)uVar39 & 1);
                                bVar12 = (bool)((byte)(uVar39 >> 1) & 1);
                                bVar13 = (bool)((byte)(uVar39 >> 2) & 1);
                                bVar14 = (bool)((byte)(uVar39 >> 3) & 1);
                                bVar15 = (bool)((byte)(uVar39 >> 4) & 1);
                                bVar16 = (bool)((byte)(uVar39 >> 5) & 1);
                                bVar17 = (bool)((byte)(uVar39 >> 6) & 1);
                                bVar18 = SUB81(uVar39 >> 7,0);
                                *(uint *)(local_410.ray + 0x100) =
                                     (uint)bVar44 * auVar82._0_4_ |
                                     (uint)!bVar44 * *(int *)(local_410.ray + 0x100);
                                *(uint *)(local_410.ray + 0x104) =
                                     (uint)bVar12 * auVar82._4_4_ |
                                     (uint)!bVar12 * *(int *)(local_410.ray + 0x104);
                                *(uint *)(local_410.ray + 0x108) =
                                     (uint)bVar13 * auVar82._8_4_ |
                                     (uint)!bVar13 * *(int *)(local_410.ray + 0x108);
                                *(uint *)(local_410.ray + 0x10c) =
                                     (uint)bVar14 * auVar82._12_4_ |
                                     (uint)!bVar14 * *(int *)(local_410.ray + 0x10c);
                                *(uint *)(local_410.ray + 0x110) =
                                     (uint)bVar15 * auVar82._16_4_ |
                                     (uint)!bVar15 * *(int *)(local_410.ray + 0x110);
                                *(uint *)(local_410.ray + 0x114) =
                                     (uint)bVar16 * auVar82._20_4_ |
                                     (uint)!bVar16 * *(int *)(local_410.ray + 0x114);
                                *(uint *)(local_410.ray + 0x118) =
                                     (uint)bVar17 * auVar82._24_4_ |
                                     (uint)!bVar17 * *(int *)(local_410.ray + 0x118);
                                *(uint *)(local_410.ray + 0x11c) =
                                     (uint)bVar18 * auVar82._28_4_ |
                                     (uint)!bVar18 * *(int *)(local_410.ray + 0x11c);
                                bVar44 = auVar32 != (undefined1  [32])0x0;
                              }
                              if (!bVar44) {
                                *(float *)(ray + k * 4 + 0x100) = fVar215;
                              }
                            }
                            auVar239 = ZEXT1664(auVar64);
                            bVar43 = (bool)(bVar43 | bVar44);
                          }
                        }
                      }
                    }
                  }
                  break;
                }
                lVar40 = lVar40 + -1;
              } while (lVar40 != 0);
            }
          }
          else {
            auVar54 = vxorps_avx512vl(ZEXT416(5),auVar62);
            auVar248 = ZEXT1664(auVar54);
          }
        }
        else {
          auVar239 = ZEXT1664(auVar237);
        }
      }
    } while (bVar20);
    auVar54 = vinsertps_avx512f(auVar58,auVar48,0x10);
  } while( true );
}

Assistant:

static __forceinline bool occluded_hn(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff p0,t0,p1,t1; Vec3fa n0,dn0,n1,dn1; geom->gather_hermite(p0,t0,n0,dn0,p1,t1,n1,dn1,geom->curve(primID));
          if (Intersector().intersect(pre,ray,k,context,geom,primID,p0,t0,p1,t1,n0,dn0,n1,dn1,Epilog(ray,k,context,geomID,primID)))
            return true;
          
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }